

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O3

void __thiscall
MakefileGenerator::writeInstalls(MakefileGenerator *this,QTextStream *t,bool noBuild)

{
  QMakeProject *pQVar1;
  QMakeProject *pQVar2;
  ProStringList l;
  QString string;
  QString string_00;
  QString file;
  QString file_00;
  QString string_01;
  QString file_01;
  int *piVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  QHash<ProKey,_ProFunctionDef> QVar9;
  char cVar10;
  char cVar11;
  bool bVar12;
  bool bVar13;
  int iVar14;
  longlong __old_val_1;
  ProStringList *pPVar15;
  QList<ProString> *vector;
  qsizetype qVar16;
  ProStringList *pPVar17;
  QArrayDataPointer<ProString> *other;
  iterator iVar18;
  iterator iVar19;
  Node<QString,_QHashDummyValue> *pNVar20;
  pointer pQVar21;
  QTextStream *pQVar22;
  QMakeProject *pQVar23;
  longlong __old_val;
  ulong uVar24;
  ulong uVar25;
  QMakeProject *pQVar26;
  MakefileGenerator *pMVar27;
  char *pcVar28;
  longlong lVar29;
  QMakeProject *pQVar30;
  ProString *this_00;
  longlong __old_val_2;
  QMakeGlobals *pQVar31;
  long lVar32;
  long in_FS_OFFSET;
  QByteArrayView QVar33;
  QStringView QVar34;
  QAnyStringView QVar35;
  QByteArrayView QVar36;
  QStringView QVar37;
  QByteArrayView QVar38;
  QByteArrayView QVar39;
  QByteArrayView QVar40;
  QByteArrayView QVar41;
  QByteArrayView QVar42;
  QByteArrayView QVar43;
  QByteArrayView QVar44;
  QByteArrayView QVar45;
  QByteArrayView QVar46;
  QLatin1String QVar47;
  QStringView QVar48;
  QLatin1String QVar49;
  QStringView config;
  QStringView config_00;
  QLatin1String QVar50;
  QStringView config_01;
  QStringView config_02;
  QStringView config_03;
  QFileInfo fi;
  QFileInfo fi_1;
  ProKey pvar;
  undefined1 in_stack_fffffffffffffad8 [15];
  char in_stack_fffffffffffffae7;
  QStringBuilder<QString_&,_QString_&> local_4b0;
  undefined1 local_4a0 [24];
  QString local_488;
  QString local_470;
  undefined1 local_458 [32];
  QString local_438;
  QString local_418;
  QString local_3f8;
  ProKey local_3d8;
  QString local_3a8;
  QStringBuilder<QString,_QString> local_388;
  undefined1 local_358 [24];
  Data *local_340;
  QMakeProject *pQStack_338;
  QMakeProject *local_330;
  QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
  QStack_328;
  QString local_318;
  QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
  local_300;
  QMakeGlobals *local_2f8;
  QMakeProject *pQStack_2f0;
  undefined1 local_2e8 [32];
  QArrayDataPointer<QString> local_2c8;
  QString local_2a8;
  undefined1 local_288 [16];
  QMakeProject *pQStack_278;
  undefined1 local_270 [16];
  QMakeProject *local_260;
  undefined1 local_258 [16];
  QMakeProject *local_248;
  QString local_238;
  QString local_218;
  QArrayDataPointer<ProString> local_200;
  QArrayDataPointer<ProString> local_1e8;
  QArrayDataPointer<QString> local_1c8;
  QArrayDataPointer<QString> local_1a8;
  QArrayDataPointer<QString> local_188;
  QString local_168;
  QString local_148;
  undefined1 local_128 [32];
  QHash<ProKey,_ProFunctionDef> local_108;
  Data *pDStack_100;
  QHash<QString,_QHashDummyValue> local_f8;
  QHash<QString,_QHashDummyValue> local_f0;
  QString local_e8;
  QString local_c8;
  undefined1 local_a8 [16];
  QHash<ProKey,_ProFunctionDef> local_98;
  undefined1 local_88 [16];
  QHash<ProKey,_ProFunctionDef> local_78;
  QMakeProject *pQStack_70;
  QMakeProject *pQStack_68;
  QMakeProject *local_60;
  ProValueMap PStack_58;
  QMakeProject *local_50;
  QMakeProject *pQStack_48;
  QMakeProject *local_40;
  Data *local_38;
  
  local_38 = *(Data **)(in_FS_OFFSET + 0x28);
  QVar33.m_data = &DAT_0000000c;
  QVar33.m_size = (qsizetype)local_88;
  QString::fromUtf8(QVar33);
  local_a8._0_8_ = local_88._0_8_;
  local_a8._8_8_ = local_88._8_8_;
  local_98.d = local_78.d;
  if ((Option::dir_sep.d.size != 1) ||
     (QVar34.m_data = Option::dir_sep.d.ptr, QVar34.m_size = 1, QVar47.m_data = "\\",
     QVar47.m_size = 1, cVar10 = QtPrivate::equalStrings(QVar34,QVar47), cVar10 == '\0')) {
    QVar35.m_size = (size_t)"-$(DEL_FILE) -r";
    QVar35.field_0.m_data = local_a8;
    QString::assign(QVar35);
  }
  local_c8.d.d = (Data *)0x0;
  local_c8.d.ptr = (char16_t *)0x0;
  local_c8.d.size = 0;
  local_e8.d.size = 0;
  local_e8.d.d = (Data *)0x0;
  local_e8.d.ptr = (char16_t *)0x0;
  local_f0.d = (Data<QHashPrivate::Node<QString,_QHashDummyValue>_> *)0x0;
  local_f8.d = (Data *)0x0;
  pQVar26 = this->project;
  ProKey::ProKey((ProKey *)local_88,"INSTALLS");
  pPVar15 = QMakeEvaluator::valuesRef(&pQVar26->super_QMakeEvaluator,(ProKey *)local_88);
  if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
    }
  }
  if ((pPVar15->super_QList<ProString>).d.size != 0) {
    pQVar26 = (QMakeProject *)(pPVar15->super_QList<ProString>).d.ptr;
    do {
      local_108.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      pDStack_100 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_128._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_128._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_128._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_128._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_88._8_8_ = ".path";
      local_88._0_8_ = pQVar26;
      ProString::ProString<ProString_const&,char_const(&)[6]>
                ((ProString *)local_128,
                 (QStringBuilder<const_ProString_&,_const_char_(&)[6]> *)local_88);
      pQVar23 = this->project;
      local_358._8_8_ = ".CONFIG";
      local_358._0_8_ = pQVar26;
      ProString::ProString<ProString_const&,char_const(&)[8]>
                ((ProString *)local_88,
                 (QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)local_358);
      vector = &QMakeEvaluator::valuesRef(&pQVar23->super_QMakeEvaluator,(ProKey *)local_88)->
                super_QList<ProString>;
      if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
             *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d == 0) {
          QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
        }
      }
      qVar16 = QtPrivate::indexOf<ProString,char[8]>(vector,(char (*) [8])"no_path",0);
      if (((qVar16 == -1) &&
          (qVar16 = QtPrivate::indexOf<ProString,char[14]>(vector,(char (*) [14])"dummy_install",0),
          qVar16 == -1)) &&
         (pPVar17 = QMakeEvaluator::valuesRef
                              (&this->project->super_QMakeEvaluator,(ProKey *)local_128),
         (pPVar17->super_QList<ProString>).d.size == 0)) {
        ProString::toLatin1((QByteArray *)local_88,(ProString *)local_128);
        pQVar23 = (QMakeProject *)local_88._8_8_;
        if ((QMakeProject *)local_88._8_8_ == (QMakeProject *)0x0) {
          pQVar23 = (QMakeProject *)&QByteArray::_empty;
        }
        warn_msg(WarnLogic,"%s is not defined: install target not created\n",pQVar23);
        if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d == 0) {
            lVar29 = 1;
            pQVar23 = (QMakeProject *)local_88._0_8_;
LAB_0016b18f:
            QArrayData::deallocate((QArrayData *)pQVar23,lVar29,0x10);
          }
        }
      }
      else {
        local_148.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_148.d.d._0_4_ = 0xaaaaaaaa;
        local_148.d.d._4_4_ = 0xaaaaaaaa;
        local_148.d.ptr._0_4_ = 0xaaaaaaaa;
        local_148.d.ptr._4_4_ = 0xaaaaaaaa;
        (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x13])(&local_148,this);
        local_168.d.d = (Data *)0x0;
        local_168.d.ptr = (char16_t *)0x0;
        local_168.d.size = 0;
        qVar16 = QtPrivate::indexOf<ProString,char[8]>(vector,(char (*) [8])"no_path",0);
        if ((qVar16 == -1) &&
           (qVar16 = QtPrivate::indexOf<ProString,char[14]>(vector,(char (*) [14])"dummy_install",0)
           , qVar16 == -1)) {
          QMakeEvaluator::first
                    ((ProString *)local_88,&this->project->super_QMakeEvaluator,(ProKey *)local_128)
          ;
          ProString::toQString(&local_388.a,(ProString *)local_88);
          fileFixify((QString *)local_358,this,&local_388.a,(FileFixifyTypes)0x4,false);
          pcVar5 = local_168.d.ptr;
          pDVar4 = local_168.d.d;
          uVar7 = local_358._16_8_;
          uVar6 = local_358._0_8_;
          local_358._0_8_ = local_168.d.d;
          local_168.d.d = (Data *)uVar6;
          local_168.d.ptr = (char16_t *)local_358._8_8_;
          local_358._8_8_ = pcVar5;
          local_358._16_8_ = local_168.d.size;
          local_168.d.size = uVar7;
          if ((QMakeProject *)pDVar4 != (QMakeProject *)0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)&pDVar4->super_QArrayData)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)&pDVar4->super_QArrayData)->m_caller)
                          ->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)&pDVar4->super_QArrayData)->m_caller)->
                         d == 0) {
              QArrayData::deallocate(&pDVar4->super_QArrayData,2,0x10);
            }
          }
          if (&(local_388.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_388.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_388.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_388.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                0) {
              QArrayData::deallocate(&(local_388.a.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
            }
          }
          cVar10 = QString::endsWith((QString *)&local_168,0x2e5bf0);
          if (cVar10 == '\0') {
            QString::append((QString *)&local_168);
          }
        }
        local_188.d = (Data *)0x0;
        local_188.ptr = (QString *)0x0;
        local_188.size = 0;
        local_1a8.size = 0;
        local_1a8.d = (Data *)0x0;
        local_1a8.ptr = (QString *)0x0;
        local_1c8.size = 0;
        local_1c8.d = (Data *)0x0;
        local_1c8.ptr = (QString *)0x0;
        local_1e8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_1e8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_1e8.ptr = (ProString *)&DAT_aaaaaaaaaaaaaaaa;
        pQVar23 = this->project;
        local_358._8_8_ = ".extra";
        local_358._0_8_ = pQVar26;
        ProString::ProString<ProString_const&,char_const(&)[7]>
                  ((ProString *)local_88,
                   (QStringBuilder<const_ProString_&,_const_char_(&)[7]> *)local_358);
        pPVar17 = QMakeEvaluator::valuesRef(&pQVar23->super_QMakeEvaluator,(ProKey *)local_88);
        local_1e8.d = (pPVar17->super_QList<ProString>).d.d;
        local_1e8.ptr = (pPVar17->super_QList<ProString>).d.ptr;
        local_1e8.size = (pPVar17->super_QList<ProString>).d.size;
        if ((ProString *)local_1e8.d != (ProString *)0x0) {
          LOCK();
          (((Type *)&(((ProString *)local_1e8.d)->m_string).d.d)->super___atomic_base<int>)._M_i =
               (((Type *)&(((ProString *)local_1e8.d)->m_string).d.d)->super___atomic_base<int>).
               _M_i + 1;
          UNLOCK();
        }
        if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
          }
        }
        if ((SourceFiles *)local_1e8.size == (SourceFiles *)0x0) {
          pQVar23 = this->project;
          local_358._8_8_ = ".commands";
          local_358._0_8_ = pQVar26;
          ProString::ProString<ProString_const&,char_const(&)[10]>
                    ((ProString *)local_88,
                     (QStringBuilder<const_ProString_&,_const_char_(&)[10]> *)local_358);
          other = (QArrayDataPointer<ProString> *)
                  QMakeEvaluator::valuesRef(&pQVar23->super_QMakeEvaluator,(ProKey *)local_88);
          QArrayDataPointer<ProString>::operator=(&local_1e8,other);
          if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
            }
          }
          if ((SourceFiles *)local_1e8.size != (SourceFiles *)0x0) goto LAB_0016775c;
          bVar13 = true;
        }
        else {
LAB_0016775c:
          ProStringList::join((QString *)local_88,(ProStringList *)&local_1e8,(QChar)0x20);
          QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                    ((QMovableArrayOps<QString> *)&local_1a8,local_1a8.size,(QString *)local_88);
          QList<QString>::end((QList<QString> *)&local_1a8);
          if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
            }
          }
          bVar13 = false;
        }
        pQVar23 = this->project;
        local_218.d.ptr = L".files";
        local_218.d.d = (Data *)pQVar26;
        ProString::ProString<ProString_const&,char_const(&)[7]>
                  ((ProString *)local_88,
                   (QStringBuilder<const_ProString_&,_const_char_(&)[7]> *)&local_218);
        pPVar17 = QMakeEvaluator::valuesRef(&pQVar23->super_QMakeEvaluator,(ProKey *)local_88);
        local_200.d = (pPVar17->super_QList<ProString>).d.d;
        local_200.ptr = (pPVar17->super_QList<ProString>).d.ptr;
        local_200.size = (pPVar17->super_QList<ProString>).d.size;
        if (local_200.d != (Data *)0x0) {
          LOCK();
          ((local_200.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_200.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        QVar36.m_data = (storage_type *)0x0;
        QVar36.m_size = (qsizetype)local_358;
        QString::fromUtf8(QVar36);
        local_3d8.super_ProString.m_string.d.d = (Data *)local_358._0_8_;
        local_3d8.super_ProString.m_string.d.ptr = (char16_t *)local_358._8_8_;
        local_3d8.super_ProString.m_string.d.size = local_358._16_8_;
        l.super_QList<ProString>.d.ptr._7_1_ = in_stack_fffffffffffffae7;
        l.super_QList<ProString>.d._0_15_ = in_stack_fffffffffffffad8;
        l.super_QList<ProString>.d.size = (qsizetype)pQVar26;
        findFilesInVPATH((ProStringList *)&local_388,this,l,'\0',(QString *)0x4);
        local_358._16_8_ = local_1e8.size;
        local_358._8_8_ = local_1e8.ptr;
        local_358._0_8_ = local_1e8.d;
        local_1e8.size = local_388.a.d.size;
        local_1e8.ptr = (ProString *)local_388.a.d.ptr;
        local_1e8.d = (Data *)local_388.a.d.d;
        local_388.a.d.size = 0;
        local_388.a.d.d = (Data *)0x0;
        local_388.a.d.ptr = (char16_t *)0x0;
        QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)local_358);
        QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_388)
        ;
        if ((QMakeProject *)local_3d8.super_ProString.m_string.d.d != (QMakeProject *)0x0) {
          LOCK();
          *(int *)&((DataPointer *)
                   &((QMakeEvaluator *)&(local_3d8.super_ProString.m_string.d.d)->super_QArrayData)
                    ->m_caller)->d =
               *(int *)&((DataPointer *)
                        &((QMakeEvaluator *)
                         &(local_3d8.super_ProString.m_string.d.d)->super_QArrayData)->m_caller)->d
               + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)
                       &((QMakeEvaluator *)
                        &(local_3d8.super_ProString.m_string.d.d)->super_QArrayData)->m_caller)->d
              == 0) {
            QArrayData::deallocate
                      (&(local_3d8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        QArrayDataPointer<ProString>::~QArrayDataPointer(&local_200);
        if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
          }
        }
        ProStringList::toQStringList((QStringList *)&local_388,(ProStringList *)&local_1e8);
        fileFixify((QStringList *)local_358,this,(QStringList *)&local_388,(FileFixifyTypes)0x4,true
                  );
        local_78.d = (Data *)local_188.size;
        local_88._8_8_ = local_188.ptr;
        local_88._0_8_ = local_188.d;
        local_188.size = local_358._16_8_;
        local_188.ptr = (QString *)local_358._8_8_;
        local_188.d = (Data *)local_358._0_8_;
        local_358._16_8_ = (QMakeProject *)0x0;
        local_358._0_8_ = (QMakeProject *)0x0;
        local_358._8_8_ = (QMakeProject *)0x0;
        QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_88);
        QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_358);
        QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_388);
        if ((SourceFiles *)local_188.size == (SourceFiles *)0x0) {
          local_358._0_8_ = (QMakeProject *)0x0;
          local_358._8_8_ = (QMakeProject *)0x0;
          local_358._16_8_ = (QMakeProject *)0x0;
          if (!bVar13) goto LAB_0016a72e;
          ProString::toQString(&local_388.a,(ProString *)pQVar26);
          (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x12])
                    ((ProString *)local_88,this,&local_388);
          QVar9.d = local_78.d;
          uVar8 = local_88._0_8_;
          uVar7 = local_358._8_8_;
          uVar6 = local_358._0_8_;
          local_88._0_8_ = local_358._0_8_;
          local_358._0_8_ = uVar8;
          local_358._8_8_ = local_88._8_8_;
          local_88._8_8_ = uVar7;
          local_78.d = (Data *)local_358._16_8_;
          local_358._16_8_ = QVar9.d;
          if ((QMakeProject *)uVar6 != (QMakeProject *)0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)uVar6)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)uVar6)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)uVar6)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)uVar6,2,0x10);
            }
          }
          if ((QMakeProject *)local_388.a.d.d != (QMakeProject *)0x0) {
            LOCK();
            *(int *)&((DataPointer *)
                     &((QMakeEvaluator *)&(local_388.a.d.d)->super_QArrayData)->m_caller)->d =
                 *(int *)&((DataPointer *)
                          &((QMakeEvaluator *)&(local_388.a.d.d)->super_QArrayData)->m_caller)->d +
                 -1;
            UNLOCK();
            pQVar23 = (QMakeProject *)local_388.a.d.d;
            if (*(int *)&((DataPointer *)
                         &((QMakeEvaluator *)&(local_388.a.d.d)->super_QArrayData)->m_caller)->d !=
                0) goto LAB_0016a7f9;
            goto LAB_0016a7f4;
          }
        }
        else {
          local_218.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_218.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_218.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          pQVar23 = this->project;
          local_388.a.d.ptr = L".base";
          local_388.a.d.d = (Data *)pQVar26;
          ProString::ProString<ProString_const&,char_const(&)[6]>
                    ((ProString *)local_358,
                     (QStringBuilder<const_ProString_&,_const_char_(&)[6]> *)&local_388);
          QMakeEvaluator::first
                    ((ProString *)local_88,&pQVar23->super_QMakeEvaluator,(ProKey *)local_358);
          ProString::toQString(&local_218,(ProString *)local_88);
          if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
            }
          }
          if ((QMakeProject *)local_358._0_8_ != (QMakeProject *)0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358._0_8_)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358._0_8_)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_358._0_8_)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_358._0_8_,2,0x10);
            }
          }
          if ((totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
               )local_218.d.size !=
              (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
               )0x0) {
            local_88._0_8_ = local_218.d.d;
            local_88._8_8_ = local_218.d.ptr;
            local_78.d = (Data *)local_218.d.size;
            if ((QMakeProject *)local_218.d.d != (QMakeProject *)0x0) {
              LOCK();
              *(int *)&((DataPointer *)
                       &((QMakeEvaluator *)&(local_218.d.d)->super_QArrayData)->m_caller)->d =
                   *(int *)&((DataPointer *)
                            &((QMakeEvaluator *)&(local_218.d.d)->super_QArrayData)->m_caller)->d +
                   1;
              UNLOCK();
            }
            string.d.ptr._7_1_ = in_stack_fffffffffffffae7;
            string.d._0_15_ = in_stack_fffffffffffffad8;
            string.d.size = (qsizetype)pQVar26;
            Option::fixString((QString *)local_358,string,(uchar)(ProString *)local_88);
            if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
              LOCK();
              *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
                   *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d + -1;
              UNLOCK();
              if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d == 0) {
                QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
              }
            }
            pcVar5 = local_218.d.ptr;
            pDVar4 = local_218.d.d;
            uVar7 = local_358._16_8_;
            uVar6 = local_358._0_8_;
            local_358._0_8_ = local_218.d.d;
            local_218.d.d = (Data *)uVar6;
            local_218.d.ptr = (char16_t *)local_358._8_8_;
            local_358._8_8_ = pcVar5;
            local_358._16_8_ = local_218.d.size;
            local_218.d.size = uVar7;
            if ((QMakeProject *)pDVar4 != (QMakeProject *)0x0) {
              LOCK();
              *(int *)&((DataPointer *)&((QMakeEvaluator *)&pDVar4->super_QArrayData)->m_caller)->d
                   = *(int *)&((DataPointer *)
                              &((QMakeEvaluator *)&pDVar4->super_QArrayData)->m_caller)->d + -1;
              UNLOCK();
              if (*(int *)&((DataPointer *)&((QMakeEvaluator *)&pDVar4->super_QArrayData)->m_caller)
                           ->d == 0) {
                QArrayData::deallocate(&pDVar4->super_QArrayData,2,0x10);
              }
            }
            cVar10 = QString::endsWith((QString *)&local_218,0x2e5bf0);
            if (cVar10 == '\0') {
              QString::append((QString *)&local_218);
            }
          }
          iVar18 = QList<QString>::begin((QList<QString> *)&local_188);
          iVar19 = QList<QString>::end((QList<QString> *)&local_188);
          if (iVar18.i != iVar19.i) {
            do {
              local_238.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              local_238.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              local_238.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
              local_88._0_8_ = ((iVar18.i)->d).d;
              local_88._8_8_ = ((iVar18.i)->d).ptr;
              local_78.d = (Data *)((iVar18.i)->d).size;
              if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
                LOCK();
                *(int *)&((DataPointer *)
                         &(((QMakeProject *)local_88._0_8_)->super_QMakeEvaluator).m_caller)->d =
                     *(int *)&((DataPointer *)
                              &(((QMakeProject *)local_88._0_8_)->super_QMakeEvaluator).m_caller)->d
                     + 1;
                UNLOCK();
              }
              string_00.d.ptr._7_1_ = in_stack_fffffffffffffae7;
              string_00.d._0_15_ = in_stack_fffffffffffffad8;
              string_00.d.size = (qsizetype)pQVar26;
              Option::fixString(&local_238,string_00,(uchar)local_88);
              if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
                LOCK();
                *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
                     *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d + -1
                ;
                UNLOCK();
                if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d == 0)
                {
                  QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
                }
              }
              local_248 = (QMakeProject *)&DAT_aaaaaaaaaaaaaaaa;
              local_258._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_258._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
              qmake_getpwd();
              local_270._0_8_ = local_238.d.d;
              local_270._8_8_ = local_238.d.ptr;
              local_260 = (QMakeProject *)local_238.d.size;
              if ((totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                   )local_238.d.d !=
                  (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                   )0x0) {
                LOCK();
                *(int *)local_238.d.d = *(int *)local_238.d.d + 1;
                UNLOCK();
              }
              iVar14 = QString::lastIndexOf
                                 ((QString *)local_270,0x2e5bf0,(CaseSensitivity)local_238.d.size);
              if (iVar14 != -1) {
                if ((QMakeProject *)(long)(iVar14 + 1) < local_260) {
                  QString::QString((QString *)local_88,(QChar *)local_270._8_8_,
                                   (longlong)(long)(iVar14 + 1));
                }
                else {
                  local_88._0_8_ = local_270._0_8_;
                  local_88._8_8_ = local_270._8_8_;
                  local_78.d = (Data *)local_260;
                  if ((QMakeProject *)local_270._0_8_ != (QMakeProject *)0x0) {
                    LOCK();
                    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_270._0_8_)->m_caller)->d =
                         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_270._0_8_)->m_caller)->d
                         + 1;
                    UNLOCK();
                  }
                }
                QVar9.d = local_78.d;
                uVar8 = local_88._0_8_;
                uVar7 = local_258._8_8_;
                uVar6 = local_258._0_8_;
                local_88._0_8_ = local_258._0_8_;
                local_258._0_8_ = uVar8;
                local_258._8_8_ = local_88._8_8_;
                local_88._8_8_ = uVar7;
                local_78.d = (Data *)local_248;
                local_248 = (QMakeProject *)QVar9.d;
                if ((QMakeProject *)uVar6 != (QMakeProject *)0x0) {
                  LOCK();
                  *(int *)&((DataPointer *)&((QMakeEvaluator *)uVar6)->m_caller)->d =
                       *(int *)&((DataPointer *)&((QMakeEvaluator *)uVar6)->m_caller)->d + -1;
                  UNLOCK();
                  if (*(int *)&((DataPointer *)&((QMakeEvaluator *)uVar6)->m_caller)->d == 0) {
                    QArrayData::deallocate((QArrayData *)uVar6,2,0x10);
                  }
                }
                QString::remove((longlong)local_270,0);
              }
              cVar10 = QString::endsWith((QString *)local_258,0x2e5bf0);
              if (cVar10 == '\0') {
                QString::append((QString *)local_258);
              }
              local_288._0_8_ = local_168.d.d;
              local_288._8_8_ = local_168.d.ptr;
              pQStack_278 = (QMakeProject *)local_168.d.size;
              if ((QMakeProject *)local_168.d.d != (QMakeProject *)0x0) {
                LOCK();
                *(int *)&((DataPointer *)
                         &((QMakeEvaluator *)&(local_168.d.d)->super_QArrayData)->m_caller)->d =
                     *(int *)&((DataPointer *)
                              &((QMakeEvaluator *)&(local_168.d.d)->super_QArrayData)->m_caller)->d
                     + 1;
                UNLOCK();
              }
              if ((totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                   )local_218.d.size !=
                  (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                   )0x0) {
                cVar10 = QString::startsWith((QString *)local_258,(CaseSensitivity)&local_218);
                if (cVar10 == '\0') {
                  QString::toLocal8Bit_helper((QChar *)local_88,(longlong)local_238.d.ptr);
                  pQVar31 = (QMakeGlobals *)local_88._8_8_;
                  if ((QMakeGlobals *)local_88._8_8_ == (QMakeGlobals *)0x0) {
                    pQVar31 = (QMakeGlobals *)&QByteArray::_empty;
                  }
                  ProString::toQString(&local_388.a,(ProString *)pQVar26);
                  QString::toLocal8Bit_helper((QChar *)local_358,(longlong)local_388.a.d.ptr);
                  pQVar23 = (QMakeProject *)local_358._8_8_;
                  if ((QMakeProject *)local_358._8_8_ == (QMakeProject *)0x0) {
                    pQVar23 = (QMakeProject *)&QByteArray::_empty;
                  }
                  QString::toLocal8Bit_helper((QChar *)&local_3d8,(longlong)local_218.d.ptr);
                  pQVar30 = (QMakeProject *)local_3d8.super_ProString.m_string.d.ptr;
                  if ((QMakeProject *)local_3d8.super_ProString.m_string.d.ptr ==
                      (QMakeProject *)0x0) {
                    pQVar30 = (QMakeProject *)&QByteArray::_empty;
                  }
                  warn_msg(WarnLogic,"File %s in install rule %s does not start with base %s",
                           pQVar31,pQVar23,pQVar30);
                  if ((QMakeProject *)local_3d8.super_ProString.m_string.d.d != (QMakeProject *)0x0)
                  {
                    LOCK();
                    *(int *)&((DataPointer *)
                             &((QMakeEvaluator *)
                              &(local_3d8.super_ProString.m_string.d.d)->super_QArrayData)->m_caller
                             )->d =
                         *(int *)&((DataPointer *)
                                  &((QMakeEvaluator *)
                                   &(local_3d8.super_ProString.m_string.d.d)->super_QArrayData)->
                                   m_caller)->d + -1;
                    UNLOCK();
                    if (*(int *)&((DataPointer *)
                                 &((QMakeEvaluator *)
                                  &(local_3d8.super_ProString.m_string.d.d)->super_QArrayData)->
                                  m_caller)->d == 0) {
                      QArrayData::deallocate
                                (&(local_3d8.super_ProString.m_string.d.d)->super_QArrayData,1,0x10)
                      ;
                    }
                  }
                  if ((QMakeProject *)local_358._0_8_ != (QMakeProject *)0x0) {
                    LOCK();
                    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358._0_8_)->m_caller)->d =
                         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358._0_8_)->m_caller)->d
                         + -1;
                    UNLOCK();
                    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_358._0_8_)->m_caller)->d
                        == 0) {
                      QArrayData::deallocate((QArrayData *)local_358._0_8_,1,0x10);
                    }
                  }
                  if ((QMakeProject *)local_388.a.d.d != (QMakeProject *)0x0) {
                    LOCK();
                    *(int *)&((DataPointer *)
                             &((QMakeEvaluator *)&(local_388.a.d.d)->super_QArrayData)->m_caller)->d
                         = *(int *)&((DataPointer *)
                                    &((QMakeEvaluator *)&(local_388.a.d.d)->super_QArrayData)->
                                     m_caller)->d + -1;
                    UNLOCK();
                    if (*(int *)&((DataPointer *)
                                 &((QMakeEvaluator *)&(local_388.a.d.d)->super_QArrayData)->m_caller
                                 )->d == 0) {
                      QArrayData::deallocate(&(local_388.a.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
                    LOCK();
                    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
                         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d
                         + -1;
                    UNLOCK();
                    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d
                        == 0) {
                      QArrayData::deallocate((QArrayData *)local_88._0_8_,1,0x10);
                    }
                  }
                }
                else {
                  local_358._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
                  local_358._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                  local_358._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                  QString::mid((longlong)local_358,(longlong)local_258);
                  QString::append((QString *)local_288);
                  if (((QMakeProject *)local_358._16_8_ != (QMakeProject *)0x0) &&
                     ((local_f0.d == (Data<QHashPrivate::Node<QString,_QHashDummyValue>_> *)0x0 ||
                      (pNVar20 = QHashPrivate::Data<QHashPrivate::Node<QString,_QHashDummyValue>_>::
                                 findNode<QString>(local_f0.d,(QString *)local_358),
                      pNVar20 == (Node<QString,_QHashDummyValue> *)0x0)))) {
                    QHash<QString,QHashDummyValue>::emplace<QHashDummyValue_const&>
                              ((QHash<QString,QHashDummyValue> *)&local_f0,(QString *)local_358,
                               (QHashDummyValue *)local_88);
                    local_388.a.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                    local_388.a.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                    local_388.a.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                    fileFixify(&local_388.a,this,(QString *)local_288,(FileFixifyTypes)0x4,false);
                    pMVar27 = (MakefileGenerator *)0x1;
                    QString::chop((longlong)&local_388);
                    filePrefixRoot((QString *)&local_3d8,pMVar27,&local_148,&local_388.a);
                    mkdir_p_asstring((QString *)local_88,this,(QString *)&local_3d8,true);
                    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                              ((QMovableArrayOps<QString> *)&local_1a8,local_1a8.size,
                               (QString *)local_88);
                    QList<QString>::end((QList<QString> *)&local_1a8);
                    if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
                      LOCK();
                      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
                           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->
                                    d + -1;
                      UNLOCK();
                      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d
                          == 0) {
                        QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
                      }
                    }
                    if ((QMakeProject *)local_3d8.super_ProString.m_string.d.d !=
                        (QMakeProject *)0x0) {
                      LOCK();
                      *(int *)&((DataPointer *)
                               &((QMakeEvaluator *)
                                &(local_3d8.super_ProString.m_string.d.d)->super_QArrayData)->
                                m_caller)->d =
                           *(int *)&((DataPointer *)
                                    &((QMakeEvaluator *)
                                     &(local_3d8.super_ProString.m_string.d.d)->super_QArrayData)->
                                     m_caller)->d + -1;
                      UNLOCK();
                      if (*(int *)&((DataPointer *)
                                   &((QMakeEvaluator *)
                                    &(local_3d8.super_ProString.m_string.d.d)->super_QArrayData)->
                                    m_caller)->d == 0) {
                        QArrayData::deallocate
                                  (&(local_3d8.super_ProString.m_string.d.d)->super_QArrayData,2,
                                   0x10);
                      }
                    }
                    pQVar23 = pQStack_278;
                    for (pQVar30 = (QMakeProject *)(long)(int)local_168.d.size;
                        (long)pQVar30 < (long)pQVar23;
                        pQVar30 = (QMakeProject *)
                                  ((long)&((DataPointer *)&(pQVar30->super_QMakeEvaluator).m_caller)
                                          ->d + 1)) {
                      if ((Option::dir_sep.d.size == 1) &&
                         (*Option::dir_sep.d.ptr ==
                          *(char16_t *)
                           ((long)&((DataPointer *)&((QMakeEvaluator *)local_288._8_8_)->m_caller)->
                                   d + (long)pQVar30 * 2))) {
                        local_3d8.super_ProString.m_string.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa
                        ;
                        local_3d8.super_ProString.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                        local_3d8.super_ProString.m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa
                        ;
                        if (pQVar30 < pQVar23) {
                          QString::QString((QString *)&local_3d8,(QChar *)local_288._8_8_,
                                           (longlong)pQVar30);
                        }
                        else {
                          local_3d8.super_ProString.m_string.d.d = (Data *)local_288._0_8_;
                          local_3d8.super_ProString.m_string.d.ptr = (char16_t *)local_288._8_8_;
                          local_3d8.super_ProString.m_string.d.size = (qsizetype)pQVar23;
                          if ((QMakeProject *)local_288._0_8_ != (QMakeProject *)0x0) {
                            LOCK();
                            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_288._0_8_)->m_caller)
                                     ->d = *(int *)&((DataPointer *)
                                                    &((QMakeEvaluator *)local_288._0_8_)->m_caller)
                                                    ->d + 1;
                            UNLOCK();
                          }
                        }
                        if (((ProString *)local_f8.d == (ProString *)0x0) ||
                           (pNVar20 = QHashPrivate::
                                      Data<QHashPrivate::Node<QString,_QHashDummyValue>_>::
                                      findNode<QString>(local_f8.d,(QString *)&local_3d8),
                           pNVar20 == (Node<QString,_QHashDummyValue> *)0x0)) {
                          QHash<QString,QHashDummyValue>::emplace<QHashDummyValue_const&>
                                    ((QHash<QString,QHashDummyValue> *)&local_f8,
                                     (QString *)&local_3d8,(QHashDummyValue *)local_88);
                          pMVar27 = this;
                          fileFixify((QString *)local_88,this,(QString *)&local_3d8,
                                     (FileFixifyTypes)0x4,false);
                          QVar9.d = local_78.d;
                          uVar6 = local_88._0_8_;
                          pcVar5 = local_388.a.d.ptr;
                          pDVar4 = local_388.a.d.d;
                          local_88._0_8_ = local_388.a.d.d;
                          local_388.a.d.d = (Data *)uVar6;
                          local_388.a.d.ptr = (char16_t *)local_88._8_8_;
                          local_88._8_8_ = pcVar5;
                          local_78.d = (Data *)local_388.a.d.size;
                          local_388.a.d.size = (qsizetype)QVar9.d;
                          if ((QMakeProject *)pDVar4 != (QMakeProject *)0x0) {
                            LOCK();
                            *(int *)&((DataPointer *)
                                     &((QMakeEvaluator *)&pDVar4->super_QArrayData)->m_caller)->d =
                                 *(int *)&((DataPointer *)
                                          &((QMakeEvaluator *)&pDVar4->super_QArrayData)->m_caller)
                                          ->d + -1;
                            UNLOCK();
                            if (*(int *)&((DataPointer *)
                                         &((QMakeEvaluator *)&pDVar4->super_QArrayData)->m_caller)->
                                         d == 0) {
                              pMVar27 = (MakefileGenerator *)0x2;
                              QArrayData::deallocate(&pDVar4->super_QArrayData,2,0x10);
                            }
                          }
                          filePrefixRoot((QString *)local_2e8,pMVar27,&local_148,&local_388.a);
                          (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                                    (&local_2c8,this,(QString *)local_2e8);
                          pQStack_70 = (QMakeProject *)local_2c8.size;
                          local_78.d = (Data *)local_2c8.ptr;
                          local_88._8_8_ = local_2c8.d;
                          local_88._0_8_ = "-$(DEL_DIR) ";
                          local_2c8.d = (Data *)0x0;
                          local_2c8.ptr = (QString *)0x0;
                          local_2c8.size = 0;
                          QStringBuilder<const_char_(&)[13],_QString>::convertTo<QString>
                                    (&local_2a8,
                                     (QStringBuilder<const_char_(&)[13],_QString> *)local_88);
                          QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                                    ((QMovableArrayOps<QString> *)&local_1c8,local_1c8.size,
                                     &local_2a8);
                          QList<QString>::end((QList<QString> *)&local_1c8);
                          if (&(local_2a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                            LOCK();
                            ((local_2a8.d.d)->super_QArrayData).ref_._q_value.
                            super___atomic_base<int>._M_i =
                                 ((local_2a8.d.d)->super_QArrayData).ref_._q_value.
                                 super___atomic_base<int>._M_i + -1;
                            UNLOCK();
                            if (((local_2a8.d.d)->super_QArrayData).ref_._q_value.
                                super___atomic_base<int>._M_i == 0) {
                              QArrayData::deallocate(&(local_2a8.d.d)->super_QArrayData,2,0x10);
                            }
                          }
                          if ((QMakeGlobals *)local_88._8_8_ != (QMakeGlobals *)0x0) {
                            LOCK();
                            (((QBasicAtomicInt *)local_88._8_8_)->_q_value).super___atomic_base<int>
                            ._M_i = (((QBasicAtomicInt *)local_88._8_8_)->_q_value).
                                    super___atomic_base<int>._M_i + -1;
                            UNLOCK();
                            if ((((QBasicAtomicInt *)local_88._8_8_)->_q_value).
                                super___atomic_base<int>._M_i == 0) {
                              QArrayData::deallocate((QArrayData *)local_88._8_8_,2,0x10);
                            }
                          }
                          if ((QMakeGlobals *)local_2c8.d != (QMakeGlobals *)0x0) {
                            LOCK();
                            *(int *)local_2c8.d = *(int *)local_2c8.d + -1;
                            UNLOCK();
                            if (*(int *)local_2c8.d == 0) {
                              QArrayData::deallocate(&(local_2c8.d)->super_QArrayData,2,0x10);
                            }
                          }
                          if ((QMakeProject *)local_2e8._0_8_ != (QMakeProject *)0x0) {
                            LOCK();
                            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2e8._0_8_)->m_caller)
                                     ->d = *(int *)&((DataPointer *)
                                                    &((QMakeEvaluator *)local_2e8._0_8_)->m_caller)
                                                    ->d + -1;
                            UNLOCK();
                            if (*(int *)&((DataPointer *)
                                         &((QMakeEvaluator *)local_2e8._0_8_)->m_caller)->d == 0) {
                              QArrayData::deallocate((QArrayData *)local_2e8._0_8_,2,0x10);
                            }
                          }
                        }
                        pQVar23 = pQStack_278;
                        if ((QMakeProject *)local_3d8.super_ProString.m_string.d.d !=
                            (QMakeProject *)0x0) {
                          LOCK();
                          *(int *)&((DataPointer *)
                                   &((QMakeEvaluator *)
                                    &(local_3d8.super_ProString.m_string.d.d)->super_QArrayData)->
                                    m_caller)->d =
                               *(int *)&((DataPointer *)
                                        &((QMakeEvaluator *)
                                         &(local_3d8.super_ProString.m_string.d.d)->super_QArrayData
                                         )->m_caller)->d + -1;
                          UNLOCK();
                          if (*(int *)&((DataPointer *)
                                       &((QMakeEvaluator *)
                                        &(local_3d8.super_ProString.m_string.d.d)->super_QArrayData)
                                        ->m_caller)->d == 0) {
                            QArrayData::deallocate
                                      (&(local_3d8.super_ProString.m_string.d.d)->super_QArrayData,2
                                       ,0x10);
                            pQVar23 = pQStack_278;
                          }
                        }
                      }
                    }
                    if ((QMakeProject *)local_388.a.d.d != (QMakeProject *)0x0) {
                      LOCK();
                      *(int *)&((DataPointer *)
                               &((QMakeEvaluator *)&(local_388.a.d.d)->super_QArrayData)->m_caller)
                               ->d = *(int *)&((DataPointer *)
                                              &((QMakeEvaluator *)
                                               &(local_388.a.d.d)->super_QArrayData)->m_caller)->d +
                                     -1;
                      UNLOCK();
                      if (*(int *)&((DataPointer *)
                                   &((QMakeEvaluator *)&(local_388.a.d.d)->super_QArrayData)->
                                    m_caller)->d == 0) {
                        QArrayData::deallocate(&(local_388.a.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                  }
                  if ((QMakeProject *)local_358._0_8_ != (QMakeProject *)0x0) {
                    LOCK();
                    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358._0_8_)->m_caller)->d =
                         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358._0_8_)->m_caller)->d
                         + -1;
                    UNLOCK();
                    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_358._0_8_)->m_caller)->d
                        == 0) {
                      QArrayData::deallocate((QArrayData *)local_358._0_8_,2,0x10);
                    }
                  }
                }
              }
              ProKey::ProKey((ProKey *)local_88,"TARGET");
              (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x16])
                        (&local_388,this,(ProKey *)local_88);
              fileFixify((QString *)local_358,this,&local_388.a,(FileFixifyTypes)0x4,true);
              if (local_238.d.size == local_358._16_8_) {
                QVar37.m_data = local_238.d.ptr;
                QVar37.m_size = local_238.d.size;
                QVar48.m_data = (storage_type_conflict *)local_358._8_8_;
                QVar48.m_size = local_238.d.size;
                cVar10 = QtPrivate::equalStrings(QVar37,QVar48);
              }
              else {
                cVar10 = '\0';
              }
              if ((QMakeProject *)local_358._0_8_ != (QMakeProject *)0x0) {
                LOCK();
                *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358._0_8_)->m_caller)->d =
                     *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358._0_8_)->m_caller)->d +
                     -1;
                UNLOCK();
                if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_358._0_8_)->m_caller)->d == 0
                   ) {
                  QArrayData::deallocate((QArrayData *)local_358._0_8_,2,0x10);
                }
              }
              if ((QMakeProject *)local_388.a.d.d != (QMakeProject *)0x0) {
                LOCK();
                *(int *)&((DataPointer *)
                         &((QMakeEvaluator *)&(local_388.a.d.d)->super_QArrayData)->m_caller)->d =
                     *(int *)&((DataPointer *)
                              &((QMakeEvaluator *)&(local_388.a.d.d)->super_QArrayData)->m_caller)->
                              d + -1;
                UNLOCK();
                if (*(int *)&((DataPointer *)
                             &((QMakeEvaluator *)&(local_388.a.d.d)->super_QArrayData)->m_caller)->d
                    == 0) {
                  QArrayData::deallocate(&(local_388.a.d.d)->super_QArrayData,2,0x10);
                }
              }
              if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
                LOCK();
                *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
                     *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d + -1
                ;
                UNLOCK();
                if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d == 0)
                {
                  QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
                }
              }
              pcVar28 = "nostrip";
              in_stack_fffffffffffffae7 =
                   ProStringList::contains((ProStringList *)vector,"nostrip",CaseSensitive);
              pDVar4 = local_238.d.d;
              if (cVar10 == '\0') {
                if ((totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                     )local_238.d.d ==
                    (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                     )0x0) {
                  local_88._0_8_ = (QMakeProject *)0x0;
                }
                else {
                  LOCK();
                  *(int *)local_238.d.d = *(int *)local_238.d.d + 1;
                  UNLOCK();
                  local_88._0_8_ = local_238.d.d;
                  LOCK();
                  *(int *)local_238.d.d = *(int *)local_238.d.d + 1;
                  UNLOCK();
                }
                local_78.d = (Data *)local_238.d.size;
                local_88._8_8_ = local_238.d.ptr;
                file.d.ptr._7_1_ = (bool)in_stack_fffffffffffffae7;
                file.d._0_15_ = in_stack_fffffffffffffad8;
                file.d.size = (qsizetype)pQVar26;
                fileInfo((MakefileGenerator *)local_358,file);
                cVar11 = QFileInfo::exists();
                QFileInfo::~QFileInfo((QFileInfo *)local_358);
                if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
                  LOCK();
                  *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
                       *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d +
                       -1;
                  UNLOCK();
                  if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d ==
                      0) {
                    pcVar28 = (char *)0x2;
                    QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
                  }
                }
                if ((totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                     )pDVar4 !=
                    (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                     )0x0) {
                  LOCK();
                  *(int *)pDVar4 = *(int *)pDVar4 + -1;
                  UNLOCK();
                  if (*(int *)pDVar4 == 0) {
                    pcVar28 = (char *)0x2;
                    QArrayData::deallocate(&pDVar4->super_QArrayData,2,0x10);
                  }
                }
                if (cVar11 != '\0') goto LAB_001686bd;
                local_2a8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                local_2a8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                local_2a8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                local_88._0_8_ = local_258._0_8_;
                local_88._8_8_ = local_258._8_8_;
                local_78.d = (Data *)local_248;
                if ((QMakeProject *)local_258._0_8_ != (QMakeProject *)0x0) {
                  LOCK();
                  *(int *)&((DataPointer *)&((QMakeEvaluator *)local_258._0_8_)->m_caller)->d =
                       *(int *)&((DataPointer *)&((QMakeEvaluator *)local_258._0_8_)->m_caller)->d +
                       1;
                  UNLOCK();
                }
                string_01.d.ptr._7_1_ = in_stack_fffffffffffffae7;
                string_01.d._0_15_ = in_stack_fffffffffffffad8;
                string_01.d.size = (qsizetype)pQVar26;
                Option::fixString(&local_2a8,string_01,
                                  (uchar)(QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[2],_QString>,_const_char_(&)[2]>,_QString>
                                          *)local_88);
                if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
                  LOCK();
                  *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
                       *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d +
                       -1;
                  UNLOCK();
                  if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d ==
                      0) {
                    QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
                  }
                }
                local_2c8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                local_2c8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                local_2c8.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
                QDir::QDir((QDir *)local_358,(QString *)&local_2a8);
                local_88._0_8_ = (QMakeProject *)0x0;
                local_88._8_8_ = (QMakeProject *)0x0;
                local_78.d = (Data *)0x0;
                QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                          ((QMovableArrayOps<QString> *)local_88,0,(QString *)local_270);
                QList<QString>::end((QList<QString> *)local_88);
                QDir::entryList(&local_2c8,(QDir *)local_358,
                                (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[2],_QString>,_const_char_(&)[2]>,_QString>
                                 *)local_88,0x6007);
                QArrayDataPointer<QString>::~QArrayDataPointer
                          ((QArrayDataPointer<QString> *)local_88);
                QDir::~QDir((QDir *)local_358);
                pcVar28 = "no_check_exist";
                bVar13 = ProStringList::contains
                                   ((ProStringList *)vector,"no_check_exist",CaseSensitive);
                if (bVar13) {
                  if ((QMakeProject *)local_2c8.size == (QMakeProject *)0x0) {
                    local_358._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
                    local_358._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                    local_358._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                    filePrefixRoot((QString *)local_358,(MakefileGenerator *)pcVar28,&local_148,
                                   (QString *)local_288);
                    cVar10 = QString::endsWith((QString *)local_358,0x2e5bf0);
                    if (cVar10 == '\0') {
                      QString::append((QString *)local_358);
                    }
                    QString::append((QString *)local_358);
                    local_388.a.d.d = (Data *)0x0;
                    local_388.a.d.ptr = (char16_t *)0x0;
                    local_388.a.d.size = 0;
                    bVar13 = ProStringList::contains
                                       ((ProStringList *)vector,"executable",CaseSensitive);
                    if (bVar13) {
                      qVar16 = 0x13;
                      pcVar28 = "$(QINSTALL_PROGRAM)";
                    }
                    else {
                      qVar16 = 0xb;
                      pcVar28 = "$(QINSTALL)";
                    }
                    QVar50.m_data = pcVar28;
                    QVar50.m_size = qVar16;
                    QString::operator=(&local_388.a,QVar50);
                    (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                              (&local_3d8,this,&local_238);
                    qVar16 = local_3d8.super_ProString.m_string.d.size;
                    pcVar5 = local_3d8.super_ProString.m_string.d.ptr;
                    pDVar4 = local_3d8.super_ProString.m_string.d.d;
                    local_3d8.super_ProString.m_string.d.size = 0;
                    local_3d8.super_ProString.m_string.d.d = (Data *)0x0;
                    local_3d8.super_ProString.m_string.d.ptr = (char16_t *)0x0;
                    (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                              (local_2e8,this,local_358);
                    local_50 = (QMakeProject *)local_2e8._16_8_;
                    PStack_58.d.d.ptr =
                         (QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                          )(QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                            )local_2e8._8_8_;
                    local_60 = (QMakeProject *)local_2e8._0_8_;
                    local_88._0_8_ = " ";
                    local_88._8_8_ = pDVar4;
                    local_78.d = (Data *)pcVar5;
                    pQStack_70 = (QMakeProject *)qVar16;
                    pQStack_68 = (QMakeProject *)0x2b1f52;
                    local_2e8._0_8_ = (QMakeProject *)0x0;
                    local_2e8._8_8_ = (QMakeProject *)0x0;
                    local_2e8._16_8_ = (ProString *)0x0;
                    ::operator+=(&local_388.a,
                                 (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[2],_QString>,_const_char_(&)[2]>,_QString>
                                  *)local_88);
                    QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[2],_QString>,_const_char_(&)[2]>,_QString>
                    ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[2],_QString>,_const_char_(&)[2]>,_QString>
                                       *)local_88);
                    if ((QMakeProject *)local_2e8._0_8_ != (QMakeProject *)0x0) {
                      LOCK();
                      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2e8._0_8_)->m_caller)->d =
                           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2e8._0_8_)->m_caller)
                                    ->d + -1;
                      UNLOCK();
                      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_2e8._0_8_)->m_caller)->
                                   d == 0) {
                        QArrayData::deallocate((QArrayData *)local_2e8._0_8_,2,0x10);
                      }
                    }
                    if ((QMakeProject *)local_3d8.super_ProString.m_string.d.d !=
                        (QMakeProject *)0x0) {
                      LOCK();
                      *(int *)&((DataPointer *)
                               &((QMakeEvaluator *)
                                &(local_3d8.super_ProString.m_string.d.d)->super_QArrayData)->
                                m_caller)->d =
                           *(int *)&((DataPointer *)
                                    &((QMakeEvaluator *)
                                     &(local_3d8.super_ProString.m_string.d.d)->super_QArrayData)->
                                     m_caller)->d + -1;
                      UNLOCK();
                      if (*(int *)&((DataPointer *)
                                   &((QMakeEvaluator *)
                                    &(local_3d8.super_ProString.m_string.d.d)->super_QArrayData)->
                                    m_caller)->d == 0) {
                        QArrayData::deallocate
                                  (&(local_3d8.super_ProString.m_string.d.d)->super_QArrayData,2,
                                   0x10);
                      }
                    }
                    QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                              ((QMovableArrayOps<QString> *)&local_1a8,local_1a8.size,&local_388.a);
                    QList<QString>::end((QList<QString> *)&local_1a8);
                    local_418.d.d = (Data *)local_288;
                    local_418.d.ptr = (char16_t *)local_270;
                    QStringBuilder<QString_&,_QString_&>::convertTo<QString>
                              (&local_3f8,(QStringBuilder<QString_&,_QString_&> *)&local_418);
                    pMVar27 = this;
                    fileFixify(&local_3a8,this,&local_3f8,(FileFixifyTypes)0x4,false);
                    filePrefixRoot(&local_318,pMVar27,&local_148,&local_3a8);
                    (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                              (local_2e8,this,&local_318);
                    pQStack_68 = (QMakeProject *)local_2e8._16_8_;
                    pQStack_70 = (QMakeProject *)local_2e8._8_8_;
                    local_78.d = (Data *)local_2e8._0_8_;
                    local_88._0_8_ = local_a8;
                    local_88._8_8_ = " ";
                    local_2e8._0_8_ = (QMakeProject *)0x0;
                    local_2e8._8_8_ = (QMakeGlobals *)0x0;
                    local_2e8._16_8_ = (ProString *)0x0;
                    QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString>::
                    convertTo<QString>((QString *)&local_3d8,
                                       (QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString>
                                        *)local_88);
                    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                              ((QMovableArrayOps<QString> *)&local_1c8,local_1c8.size,
                               (QString *)&local_3d8);
                    QList<QString>::end((QList<QString> *)&local_1c8);
                    if ((QMakeProject *)local_3d8.super_ProString.m_string.d.d !=
                        (QMakeProject *)0x0) {
                      LOCK();
                      *(int *)&((DataPointer *)
                               &((QMakeEvaluator *)
                                &(local_3d8.super_ProString.m_string.d.d)->super_QArrayData)->
                                m_caller)->d =
                           *(int *)&((DataPointer *)
                                    &((QMakeEvaluator *)
                                     &(local_3d8.super_ProString.m_string.d.d)->super_QArrayData)->
                                     m_caller)->d + -1;
                      UNLOCK();
                      if (*(int *)&((DataPointer *)
                                   &((QMakeEvaluator *)
                                    &(local_3d8.super_ProString.m_string.d.d)->super_QArrayData)->
                                    m_caller)->d == 0) {
                        QArrayData::deallocate
                                  (&(local_3d8.super_ProString.m_string.d.d)->super_QArrayData,2,
                                   0x10);
                      }
                    }
                    if ((QMakeProject *)local_78.d != (QMakeProject *)0x0) {
                      LOCK();
                      *(int *)&((DataPointer *)&((QMakeEvaluator *)&(local_78.d)->ref)->m_caller)->d
                           = *(int *)&((DataPointer *)
                                      &((QMakeEvaluator *)&(local_78.d)->ref)->m_caller)->d + -1;
                      UNLOCK();
                      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)&(local_78.d)->ref)->m_caller
                                   )->d == 0) {
                        QArrayData::deallocate((QArrayData *)local_78.d,2,0x10);
                      }
                    }
                    if ((QMakeProject *)local_2e8._0_8_ != (QMakeProject *)0x0) {
                      LOCK();
                      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2e8._0_8_)->m_caller)->d =
                           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2e8._0_8_)->m_caller)
                                    ->d + -1;
                      UNLOCK();
                      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_2e8._0_8_)->m_caller)->
                                   d == 0) {
                        QArrayData::deallocate((QArrayData *)local_2e8._0_8_,2,0x10);
                      }
                    }
                    if (&(local_318.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_318.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_318.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_318.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        QArrayData::deallocate(&(local_318.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    if ((QMakeProject *)local_3a8.d.d != (QMakeProject *)0x0) {
                      LOCK();
                      *(int *)&((DataPointer *)
                               &((QMakeEvaluator *)&(local_3a8.d.d)->super_QArrayData)->m_caller)->d
                           = *(int *)&((DataPointer *)
                                      &((QMakeEvaluator *)&(local_3a8.d.d)->super_QArrayData)->
                                       m_caller)->d + -1;
                      UNLOCK();
                      if (*(int *)&((DataPointer *)
                                   &((QMakeEvaluator *)&(local_3a8.d.d)->super_QArrayData)->m_caller
                                   )->d == 0) {
                        QArrayData::deallocate(&(local_3a8.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    if ((QMakeProject *)local_3f8.d.d != (QMakeProject *)0x0) {
                      LOCK();
                      *(int *)&((DataPointer *)
                               &((QMakeEvaluator *)&(local_3f8.d.d)->super_QArrayData)->m_caller)->d
                           = *(int *)&((DataPointer *)
                                      &((QMakeEvaluator *)&(local_3f8.d.d)->super_QArrayData)->
                                       m_caller)->d + -1;
                      UNLOCK();
                      if (*(int *)&((DataPointer *)
                                   &((QMakeEvaluator *)&(local_3f8.d.d)->super_QArrayData)->m_caller
                                   )->d == 0) {
                        QArrayData::deallocate(&(local_3f8.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    if ((QMakeProject *)local_388.a.d.d != (QMakeProject *)0x0) {
                      LOCK();
                      *(int *)&((DataPointer *)
                               &((QMakeEvaluator *)&(local_388.a.d.d)->super_QArrayData)->m_caller)
                               ->d = *(int *)&((DataPointer *)
                                              &((QMakeEvaluator *)
                                               &(local_388.a.d.d)->super_QArrayData)->m_caller)->d +
                                     -1;
                      UNLOCK();
                      if (*(int *)&((DataPointer *)
                                   &((QMakeEvaluator *)&(local_388.a.d.d)->super_QArrayData)->
                                    m_caller)->d == 0) {
                        QArrayData::deallocate(&(local_388.a.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    if ((QMakeProject *)local_358._0_8_ != (QMakeProject *)0x0) {
                      LOCK();
                      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358._0_8_)->m_caller)->d =
                           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358._0_8_)->m_caller)
                                    ->d + -1;
                      UNLOCK();
                      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_358._0_8_)->m_caller)->
                                   d == 0) {
                        QArrayData::deallocate((QArrayData *)local_358._0_8_,2,0x10);
                      }
                    }
                    goto LAB_001699c7;
                  }
LAB_001699d0:
                  lVar32 = 0x10;
                  pQVar23 = (QMakeProject *)0x0;
                  do {
                    local_2e8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
                    local_2e8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                    local_2e8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                    pQVar21 = QList<QString>::data((QList<QString> *)&local_2c8);
                    local_2e8._0_8_ = *(long *)((long)pQVar21 + lVar32 + -0x10);
                    local_2e8._8_8_ = *(undefined8 *)((long)pQVar21 + lVar32 + -8);
                    local_2e8._16_8_ = *(undefined8 *)((long)&(pQVar21->d).d + lVar32);
                    if ((QMakeProject *)local_2e8._0_8_ != (QMakeProject *)0x0) {
                      LOCK();
                      *(int *)&((DataPointer *)
                               &(((QMakeProject *)local_2e8._0_8_)->super_QMakeEvaluator).m_caller)
                               ->d = *(int *)&((DataPointer *)
                                              &(((QMakeProject *)local_2e8._0_8_)->
                                               super_QMakeEvaluator).m_caller)->d + 1;
                      UNLOCK();
                    }
                    local_3f8.d.d = (Data *)local_288;
                    local_3f8.d.ptr = (char16_t *)local_2e8;
                    QStringBuilder<QString_&,_QString_&>::convertTo<QString>
                              (&local_3a8,(QStringBuilder<QString_&,_QString_&> *)&local_3f8);
                    pMVar27 = this;
                    fileFixify(&local_318,this,&local_3a8,(FileFixifyTypes)0x4,false);
                    filePrefixRoot((QString *)&local_3d8,pMVar27,&local_148,&local_318);
                    (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                              (&local_388,this,&local_3d8);
                    pQStack_68 = (QMakeProject *)local_388.a.d.size;
                    pQStack_70 = (QMakeProject *)local_388.a.d.ptr;
                    local_78.d = (Data *)local_388.a.d.d;
                    local_88._0_8_ = local_a8;
                    local_88._8_8_ = " ";
                    local_388.a.d.d = (Data *)0x0;
                    local_388.a.d.ptr = (char16_t *)0x0;
                    local_388.a.d.size = 0;
                    QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString>::
                    convertTo<QString>((QString *)local_358,
                                       (QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString>
                                        *)local_88);
                    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                              ((QMovableArrayOps<QString> *)&local_1c8,local_1c8.size,
                               (QString *)local_358);
                    QList<QString>::end((QList<QString> *)&local_1c8);
                    if ((QMakeProject *)local_358._0_8_ != (QMakeProject *)0x0) {
                      LOCK();
                      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358._0_8_)->m_caller)->d =
                           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358._0_8_)->m_caller)
                                    ->d + -1;
                      UNLOCK();
                      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_358._0_8_)->m_caller)->
                                   d == 0) {
                        QArrayData::deallocate((QArrayData *)local_358._0_8_,2,0x10);
                      }
                    }
                    if ((QMakeProject *)local_78.d != (QMakeProject *)0x0) {
                      LOCK();
                      *(int *)&((DataPointer *)&((QMakeEvaluator *)&(local_78.d)->ref)->m_caller)->d
                           = *(int *)&((DataPointer *)
                                      &((QMakeEvaluator *)&(local_78.d)->ref)->m_caller)->d + -1;
                      UNLOCK();
                      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)&(local_78.d)->ref)->m_caller
                                   )->d == 0) {
                        QArrayData::deallocate((QArrayData *)local_78.d,2,0x10);
                      }
                    }
                    if ((QMakeGlobals *)local_388.a.d.d != (QMakeGlobals *)0x0) {
                      LOCK();
                      *(int *)local_388.a.d.d = *(int *)local_388.a.d.d + -1;
                      UNLOCK();
                      if (*(int *)local_388.a.d.d == 0) {
                        QArrayData::deallocate(&(local_388.a.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    if ((QMakeProject *)local_3d8.super_ProString.m_string.d.d !=
                        (QMakeProject *)0x0) {
                      LOCK();
                      *(int *)&((DataPointer *)
                               &((QMakeEvaluator *)
                                &(local_3d8.super_ProString.m_string.d.d)->super_QArrayData)->
                                m_caller)->d =
                           *(int *)&((DataPointer *)
                                    &((QMakeEvaluator *)
                                     &(local_3d8.super_ProString.m_string.d.d)->super_QArrayData)->
                                     m_caller)->d + -1;
                      UNLOCK();
                      if (*(int *)&((DataPointer *)
                                   &((QMakeEvaluator *)
                                    &(local_3d8.super_ProString.m_string.d.d)->super_QArrayData)->
                                    m_caller)->d == 0) {
                        QArrayData::deallocate
                                  (&(local_3d8.super_ProString.m_string.d.d)->super_QArrayData,2,
                                   0x10);
                      }
                    }
                    if (&(local_318.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_318.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_318.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_318.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        QArrayData::deallocate(&(local_318.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    if ((QMakeProject *)local_3a8.d.d != (QMakeProject *)0x0) {
                      LOCK();
                      *(int *)&((DataPointer *)
                               &((QMakeEvaluator *)&(local_3a8.d.d)->super_QArrayData)->m_caller)->d
                           = *(int *)&((DataPointer *)
                                      &((QMakeEvaluator *)&(local_3a8.d.d)->super_QArrayData)->
                                       m_caller)->d + -1;
                      UNLOCK();
                      if (*(int *)&((DataPointer *)
                                   &((QMakeEvaluator *)&(local_3a8.d.d)->super_QArrayData)->m_caller
                                   )->d == 0) {
                        QArrayData::deallocate(&(local_3a8.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    local_458._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                    local_88._8_8_ = local_2e8;
                    local_88._0_8_ = (QMakeProject *)local_258;
                    QStringBuilder<QString_&,_QString_&>::convertTo<QString>
                              (&local_470,(QStringBuilder<QString_&,_QString_&> *)local_88);
                    file_01.d.ptr._7_1_ = in_stack_fffffffffffffae7;
                    file_01.d._0_15_ = in_stack_fffffffffffffad8;
                    file_01.d.size = (qsizetype)pQVar26;
                    fileInfo((MakefileGenerator *)local_458,file_01);
                    if (&(local_470.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_470.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_470.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_470.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        QArrayData::deallocate(&(local_470.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    local_318.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                    local_318.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                    local_318.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                    pMVar27 = this;
                    fileFixify((QString *)local_88,this,(QString *)local_288,(FileFixifyTypes)0x4,
                               false);
                    filePrefixRoot(&local_318,pMVar27,&local_148,(QString *)local_88);
                    uVar6 = local_88._0_8_;
                    if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
                      LOCK();
                      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
                           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->
                                    d + -1;
                      UNLOCK();
                      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)uVar6)->m_caller)->d == 0) {
                        QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
                      }
                    }
                    cVar10 = QString::endsWith((QString *)&local_318,0x2e5bf0);
                    if (cVar10 == '\0') {
                      QString::append((QString *)&local_318);
                    }
                    QFileInfo::fileName();
                    QString::append((QString *)&local_318);
                    uVar6 = local_88._0_8_;
                    if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
                      LOCK();
                      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
                           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->
                                    d + -1;
                      UNLOCK();
                      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)uVar6)->m_caller)->d == 0) {
                        QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
                      }
                    }
                    local_3a8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                    local_3a8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                    local_3a8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                    local_3d8.super_ProString.m_string.d.ptr = (char16_t *)local_2e8;
                    local_3d8.super_ProString.m_string.d.d = (Data *)local_258;
                    escapeFilePath<QString&,QString&>
                              ((QString *)local_358,this,
                               (QStringBuilder<QString_&,_QString_&> *)&local_3d8);
                    uVar8 = local_358._16_8_;
                    uVar7 = local_358._8_8_;
                    uVar6 = local_358._0_8_;
                    local_358._16_8_ = (QMakeProject *)0x0;
                    local_358._0_8_ = (QMakeProject *)0x0;
                    local_358._8_8_ = (QMakeProject *)0x0;
                    (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                              (&local_388,this,&local_318);
                    pQStack_48 = (QMakeProject *)local_388.a.d.size;
                    local_50 = (QMakeProject *)local_388.a.d.ptr;
                    PStack_58.d.d.ptr =
                         (QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                          )(QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                            )local_388.a.d.d;
                    local_88._0_8_ = &DAT_0000000c;
                    local_88._8_8_ = anon_var_dwarf_155e0f;
                    local_78.d = (Data *)uVar6;
                    pQStack_70 = (QMakeProject *)uVar7;
                    pQStack_68 = (QMakeProject *)uVar8;
                    local_60 = (QMakeProject *)0x2b1f52;
                    local_388.a.d.d = (Data *)0x0;
                    local_388.a.d.ptr = (char16_t *)0x0;
                    local_388.a.d.size = 0;
                    QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString>,_const_char_(&)[2]>,_QString>
                    ::convertTo<QString>
                              (&local_3a8,
                               (QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString>,_const_char_(&)[2]>,_QString>
                                *)local_88);
                    QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString>,_const_char_(&)[2]>,_QString>
                    ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString>,_const_char_(&)[2]>,_QString>
                                       *)local_88);
                    if ((QMakeProject *)local_388.a.d.d != (QMakeProject *)0x0) {
                      LOCK();
                      *(int *)&((DataPointer *)
                               &((QMakeEvaluator *)&(local_388.a.d.d)->super_QArrayData)->m_caller)
                               ->d = *(int *)&((DataPointer *)
                                              &((QMakeEvaluator *)
                                               &(local_388.a.d.d)->super_QArrayData)->m_caller)->d +
                                     -1;
                      UNLOCK();
                      if (*(int *)&((DataPointer *)
                                   &((QMakeEvaluator *)&(local_388.a.d.d)->super_QArrayData)->
                                    m_caller)->d == 0) {
                        QArrayData::deallocate(&(local_388.a.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    if ((QMakeProject *)local_358._0_8_ != (QMakeProject *)0x0) {
                      LOCK();
                      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358._0_8_)->m_caller)->d =
                           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358._0_8_)->m_caller)
                                    ->d + -1;
                      UNLOCK();
                      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_358._0_8_)->m_caller)->
                                   d == 0) {
                        QArrayData::deallocate((QArrayData *)local_358._0_8_,2,0x10);
                      }
                    }
                    QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                              ((QMovableArrayOps<QString> *)&local_1a8,local_1a8.size,&local_3a8);
                    QList<QString>::end((QList<QString> *)&local_1a8);
                    if (in_stack_fffffffffffffae7 == '\0') {
                      pQVar30 = this->project;
                      QVar41.m_data = (storage_type *)0xa;
                      QVar41.m_size = (qsizetype)local_88;
                      QString::fromUtf8(QVar41);
                      uVar6 = local_88._0_8_;
                      bVar13 = false;
                      config_01.m_data = (storage_type_conflict *)local_88._8_8_;
                      config_01.m_size = (qsizetype)local_78.d;
                      bVar12 = QMakeEvaluator::isActiveConfig
                                         (&pQVar30->super_QMakeEvaluator,config_01,false);
                      if (!bVar12) {
                        pQVar30 = this->project;
                        QVar42.m_data = (storage_type *)0x7;
                        QVar42.m_size = (qsizetype)local_88;
                        QString::fromUtf8(QVar42);
                        uVar7 = local_88._0_8_;
                        bVar13 = false;
                        config_02.m_data = (storage_type_conflict *)local_88._8_8_;
                        config_02.m_size = (qsizetype)local_78.d;
                        bVar12 = QMakeEvaluator::isActiveConfig
                                           (&pQVar30->super_QMakeEvaluator,config_02,false);
                        if (!bVar12) {
                          cVar10 = QFileInfo::isDir();
                          if ((cVar10 == '\0') &&
                             (cVar10 = QFileInfo::isExecutable(), cVar10 != '\0')) {
                            pQVar30 = this->project;
                            ProKey::ProKey((ProKey *)local_88,"QMAKE_STRIP");
                            bVar13 = QMakeProject::isEmpty(pQVar30,(ProKey *)local_88);
                            if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
                              LOCK();
                              *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller
                                       )->d =
                                   *(int *)&((DataPointer *)
                                            &((QMakeEvaluator *)local_88._0_8_)->m_caller)->d + -1;
                              UNLOCK();
                              if (*(int *)&((DataPointer *)
                                           &((QMakeEvaluator *)local_88._0_8_)->m_caller)->d == 0) {
                                QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
                              }
                            }
                            bVar13 = !bVar13;
                          }
                          else {
                            bVar13 = false;
                          }
                        }
                        if ((QMakeProject *)uVar7 != (QMakeProject *)0x0) {
                          LOCK();
                          *(int *)&((DataPointer *)&((QMakeEvaluator *)uVar7)->m_caller)->d =
                               *(int *)&((DataPointer *)&((QMakeEvaluator *)uVar7)->m_caller)->d +
                               -1;
                          UNLOCK();
                          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)uVar7)->m_caller)->d == 0
                             ) {
                            QArrayData::deallocate((QArrayData *)uVar7,2,0x10);
                          }
                        }
                      }
                      if ((QMakeProject *)uVar6 != (QMakeProject *)0x0) {
                        LOCK();
                        *(int *)&((DataPointer *)&((QMakeEvaluator *)uVar6)->m_caller)->d =
                             *(int *)&((DataPointer *)&((QMakeEvaluator *)uVar6)->m_caller)->d + -1;
                        UNLOCK();
                        if (*(int *)&((DataPointer *)&((QMakeEvaluator *)uVar6)->m_caller)->d == 0)
                        {
                          QArrayData::deallocate((QArrayData *)uVar6,2,0x10);
                        }
                      }
                      if (bVar13) {
                        QVar43.m_data = (storage_type *)0x1;
                        QVar43.m_size = (qsizetype)local_88;
                        QString::fromUtf8(QVar43);
                        QVar9.d = local_78.d;
                        uVar7 = local_88._8_8_;
                        uVar6 = local_88._0_8_;
                        ProKey::ProKey(&local_3d8,"QMAKE_STRIP");
                        (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x16])
                                  (&local_418,this,&local_3d8);
                        local_330 = (QMakeProject *)local_418.d.size;
                        pQStack_338 = (QMakeProject *)local_418.d.ptr;
                        local_340 = local_418.d.d;
                        local_418.d.size = 0;
                        local_388.a.d.d = (Data *)0x0;
                        local_388.a.d.ptr = (char16_t *)0x0;
                        local_358._0_8_ = uVar6;
                        local_358._8_8_ = uVar7;
                        local_388.a.d.size = 0;
                        local_358._16_8_ = QVar9.d;
                        local_388.b.d.d = (Data *)0x0;
                        local_388.b.d.ptr = (char16_t *)0x0;
                        local_418.d.d = (Data *)0x0;
                        local_418.d.ptr = (char16_t *)0x0;
                        local_388.b.d.size = 0;
                        QStack_328.d.ptr =
                             (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                              )(QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>
                                *)0x2b1f52;
                        local_4b0.a = (QString *)local_288;
                        local_4b0.b = (QString *)local_2e8;
                        QStringBuilder<QString_&,_QString_&>::convertTo<QString>
                                  ((QString *)local_4a0,&local_4b0);
                        pMVar27 = this;
                        fileFixify(&local_488,this,(QString *)local_4a0,(FileFixifyTypes)0x4,false);
                        filePrefixRoot((QString *)(local_458 + 8),pMVar27,&local_148,&local_488);
                        (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                                  (&local_438,this,(QString *)(local_458 + 8));
                        local_60 = local_330;
                        pQStack_68 = pQStack_338;
                        pQStack_70 = (QMakeProject *)local_340;
                        local_78.d = (Data *)local_358._16_8_;
                        local_88._8_8_ = local_358._8_8_;
                        local_88._0_8_ = local_358._0_8_;
                        local_40 = (QMakeProject *)local_438.d.size;
                        pQStack_48 = (QMakeProject *)local_438.d.ptr;
                        local_50 = (QMakeProject *)local_438.d.d;
                        local_358._0_8_ = (QMakeProject *)0x0;
                        local_358._8_8_ = (QMakeProject *)0x0;
                        local_358._16_8_ = (QMakeProject *)0x0;
                        local_340 = (Data *)0x0;
                        pQStack_338 = (QMakeProject *)0x0;
                        local_330 = (QMakeProject *)0x0;
                        PStack_58.d.d.ptr =
                             (QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                              )(QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                                )QStack_328.d.ptr;
                        local_438.d.d = (Data *)0x0;
                        local_438.d.ptr = (char16_t *)0x0;
                        local_438.d.size = 0;
                        QStringBuilder<QStringBuilder<QStringBuilder<QString,_QString>,_const_char_(&)[2]>,_QString>
                        ::convertTo<QString>
                                  (&local_3f8,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<QString,_QString>,_const_char_(&)[2]>,_QString>
                                    *)local_88);
                        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                                  ((QMovableArrayOps<QString> *)&local_1a8,local_1a8.size,&local_3f8
                                  );
                        QList<QString>::end((QList<QString> *)&local_1a8);
                        if ((QMakeProject *)local_3f8.d.d != (QMakeProject *)0x0) {
                          LOCK();
                          *(int *)&((DataPointer *)
                                   &((QMakeEvaluator *)&(local_3f8.d.d)->super_QArrayData)->m_caller
                                   )->d =
                               *(int *)&((DataPointer *)
                                        &((QMakeEvaluator *)&(local_3f8.d.d)->super_QArrayData)->
                                         m_caller)->d + -1;
                          UNLOCK();
                          if (*(int *)&((DataPointer *)
                                       &((QMakeEvaluator *)&(local_3f8.d.d)->super_QArrayData)->
                                        m_caller)->d == 0) {
                            QArrayData::deallocate(&(local_3f8.d.d)->super_QArrayData,2,0x10);
                          }
                        }
                        QStringBuilder<QStringBuilder<QStringBuilder<QString,_QString>,_const_char_(&)[2]>,_QString>
                        ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QString,_QString>,_const_char_(&)[2]>,_QString>
                                           *)local_88);
                        if ((QMakeProject *)local_438.d.d != (QMakeProject *)0x0) {
                          LOCK();
                          *(int *)&((DataPointer *)
                                   &((QMakeEvaluator *)&(local_438.d.d)->super_QArrayData)->m_caller
                                   )->d =
                               *(int *)&((DataPointer *)
                                        &((QMakeEvaluator *)&(local_438.d.d)->super_QArrayData)->
                                         m_caller)->d + -1;
                          UNLOCK();
                          if (*(int *)&((DataPointer *)
                                       &((QMakeEvaluator *)&(local_438.d.d)->super_QArrayData)->
                                        m_caller)->d == 0) {
                            QArrayData::deallocate(&(local_438.d.d)->super_QArrayData,2,0x10);
                          }
                        }
                        if ((QArrayData *)local_458._8_8_ != (QArrayData *)0x0) {
                          LOCK();
                          (((QBasicAtomicInt *)local_458._8_8_)->_q_value).super___atomic_base<int>.
                          _M_i = (((QBasicAtomicInt *)local_458._8_8_)->_q_value).
                                 super___atomic_base<int>._M_i + -1;
                          UNLOCK();
                          if ((((QBasicAtomicInt *)local_458._8_8_)->_q_value).
                              super___atomic_base<int>._M_i == 0) {
                            QArrayData::deallocate((QArrayData *)local_458._8_8_,2,0x10);
                          }
                        }
                        if (&(local_488.d.d)->super_QArrayData != (QArrayData *)0x0) {
                          LOCK();
                          ((local_488.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i = ((local_488.d.d)->super_QArrayData).ref_._q_value.
                                  super___atomic_base<int>._M_i + -1;
                          UNLOCK();
                          if (((local_488.d.d)->super_QArrayData).ref_._q_value.
                              super___atomic_base<int>._M_i == 0) {
                            QArrayData::deallocate(&(local_488.d.d)->super_QArrayData,2,0x10);
                          }
                        }
                        if ((QArrayData *)local_4a0._0_8_ != (QArrayData *)0x0) {
                          LOCK();
                          (((QBasicAtomicInt *)local_4a0._0_8_)->_q_value).super___atomic_base<int>.
                          _M_i = (((QBasicAtomicInt *)local_4a0._0_8_)->_q_value).
                                 super___atomic_base<int>._M_i + -1;
                          UNLOCK();
                          if ((((QBasicAtomicInt *)local_4a0._0_8_)->_q_value).
                              super___atomic_base<int>._M_i == 0) {
                            QArrayData::deallocate((QArrayData *)local_4a0._0_8_,2,0x10);
                          }
                        }
                        QStringBuilder<QString,_QString>::~QStringBuilder
                                  ((QStringBuilder<QString,_QString> *)local_358);
                        QStringBuilder<QString,_QString>::~QStringBuilder(&local_388);
                        if ((QMakeProject *)local_418.d.d != (QMakeProject *)0x0) {
                          LOCK();
                          *(int *)&((DataPointer *)
                                   &((QMakeEvaluator *)&(local_418.d.d)->super_QArrayData)->m_caller
                                   )->d =
                               *(int *)&((DataPointer *)
                                        &((QMakeEvaluator *)&(local_418.d.d)->super_QArrayData)->
                                         m_caller)->d + -1;
                          UNLOCK();
                          if (*(int *)&((DataPointer *)
                                       &((QMakeEvaluator *)&(local_418.d.d)->super_QArrayData)->
                                        m_caller)->d == 0) {
                            QArrayData::deallocate(&(local_418.d.d)->super_QArrayData,2,0x10);
                          }
                        }
                        if ((QMakeProject *)local_3d8.super_ProString.m_string.d.d !=
                            (QMakeProject *)0x0) {
                          LOCK();
                          *(int *)&((DataPointer *)
                                   &((QMakeEvaluator *)
                                    &(local_3d8.super_ProString.m_string.d.d)->super_QArrayData)->
                                    m_caller)->d =
                               *(int *)&((DataPointer *)
                                        &((QMakeEvaluator *)
                                         &(local_3d8.super_ProString.m_string.d.d)->super_QArrayData
                                         )->m_caller)->d + -1;
                          UNLOCK();
                          if (*(int *)&((DataPointer *)
                                       &((QMakeEvaluator *)
                                        &(local_3d8.super_ProString.m_string.d.d)->super_QArrayData)
                                        ->m_caller)->d == 0) {
                            QArrayData::deallocate
                                      (&(local_3d8.super_ProString.m_string.d.d)->super_QArrayData,2
                                       ,0x10);
                          }
                        }
                      }
                    }
                    if ((QMakeProject *)local_3a8.d.d != (QMakeProject *)0x0) {
                      LOCK();
                      *(int *)&((DataPointer *)
                               &((QMakeEvaluator *)&(local_3a8.d.d)->super_QArrayData)->m_caller)->d
                           = *(int *)&((DataPointer *)
                                      &((QMakeEvaluator *)&(local_3a8.d.d)->super_QArrayData)->
                                       m_caller)->d + -1;
                      UNLOCK();
                      if (*(int *)&((DataPointer *)
                                   &((QMakeEvaluator *)&(local_3a8.d.d)->super_QArrayData)->m_caller
                                   )->d == 0) {
                        QArrayData::deallocate(&(local_3a8.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    if (&(local_318.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_318.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_318.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_318.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        QArrayData::deallocate(&(local_318.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    QFileInfo::~QFileInfo((QFileInfo *)local_458);
                    if ((QMakeProject *)local_2e8._0_8_ != (QMakeProject *)0x0) {
                      LOCK();
                      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2e8._0_8_)->m_caller)->d =
                           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2e8._0_8_)->m_caller)
                                    ->d + -1;
                      UNLOCK();
                      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_2e8._0_8_)->m_caller)->
                                   d == 0) {
                        QArrayData::deallocate((QArrayData *)local_2e8._0_8_,2,0x10);
                      }
                    }
                    pQVar23 = (QMakeProject *)
                              ((long)&((DataPointer *)&(pQVar23->super_QMakeEvaluator).m_caller)->d
                              + 1);
                    lVar32 = lVar32 + 0x18;
                  } while (pQVar23 < (ulong)local_2c8.size);
                }
                else {
LAB_001699c7:
                  if ((QMakeProject *)local_2c8.size != (QMakeProject *)0x0) goto LAB_001699d0;
                }
                QArrayDataPointer<QString>::~QArrayDataPointer(&local_2c8);
                if (&(local_2a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_2a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_2a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_2a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i == 0) {
                    QArrayData::deallocate(&(local_2a8.d.d)->super_QArrayData,2,0x10);
                  }
                }
              }
              else {
LAB_001686bd:
                local_4a0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_300.d.ptr =
                     (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                      )(totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                        )local_238.d.d;
                local_2f8 = (QMakeGlobals *)local_238.d.ptr;
                pQStack_2f0 = (QMakeProject *)local_238.d.size;
                if ((totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                     )local_238.d.d !=
                    (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                     )0x0) {
                  LOCK();
                  *(int *)local_238.d.d = *(int *)local_238.d.d + 1;
                  UNLOCK();
                }
                file_00.d.ptr._7_1_ = in_stack_fffffffffffffae7;
                file_00.d._0_15_ = in_stack_fffffffffffffad8;
                file_00.d.size = (qsizetype)pQVar26;
                fileInfo((MakefileGenerator *)local_4a0,file_00);
                if (local_300.d.ptr !=
                    (QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>
                     *)0x0) {
                  LOCK();
                  *(int *)&((DataPointer *)&((QMakeEvaluator *)local_300.d.ptr)->m_caller)->d =
                       *(int *)&((DataPointer *)&((QMakeEvaluator *)local_300.d.ptr)->m_caller)->d +
                       -1;
                  UNLOCK();
                  if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_300.d.ptr)->m_caller)->d ==
                      0) {
                    pcVar28 = (char *)0x2;
                    QArrayData::deallocate((QArrayData *)local_300.d.ptr,2,0x10);
                  }
                }
                local_2a8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                local_2a8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                local_2a8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                filePrefixRoot(&local_2a8,(MakefileGenerator *)pcVar28,&local_148,
                               (QString *)local_288);
                cVar11 = QString::endsWith((QString *)&local_2a8,0x2e5bf0);
                if (cVar11 == '\0') {
                  QString::append((QString *)&local_2a8);
                }
                QFileInfo::fileName();
                QString::append((QString *)&local_2a8);
                if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
                  LOCK();
                  *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
                       *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d +
                       -1;
                  UNLOCK();
                  if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d ==
                      0) {
                    QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
                  }
                }
                local_2c8.d = (Data *)0x0;
                local_2c8.ptr = (QString *)0x0;
                local_2c8.size = 0;
                if ((cVar10 == '\0') &&
                   ((cVar10 = QFileInfo::isDir(), cVar10 != '\0' ||
                    (cVar10 = QFileInfo::isExecutable(), cVar10 == '\0')))) {
                  qVar16 = 0xb;
                  pcVar28 = "$(QINSTALL)";
                }
                else {
                  qVar16 = 0x13;
                  pcVar28 = "$(QINSTALL_PROGRAM)";
                }
                QVar49.m_data = pcVar28;
                QVar49.m_size = qVar16;
                QString::operator=((QString *)&local_2c8,QVar49);
                (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                          (local_358,this,&local_238);
                uVar8 = local_358._16_8_;
                uVar7 = local_358._8_8_;
                uVar6 = local_358._0_8_;
                local_358._16_8_ = (QMakeProject *)0x0;
                local_358._0_8_ = (QMakeProject *)0x0;
                local_358._8_8_ = (QMakeProject *)0x0;
                (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                          (&local_388,this,&local_2a8);
                local_50 = (QMakeProject *)local_388.a.d.size;
                PStack_58.d.d.ptr =
                     (QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                      )(QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                        )local_388.a.d.ptr;
                local_60 = (QMakeProject *)local_388.a.d.d;
                local_88._0_8_ = " ";
                local_88._8_8_ = uVar6;
                local_78.d = (Data *)uVar7;
                pQStack_70 = (QMakeProject *)uVar8;
                pQStack_68 = (QMakeProject *)0x2b1f52;
                local_388.a.d.d = (Data *)0x0;
                local_388.a.d.ptr = (char16_t *)0x0;
                local_388.a.d.size = 0;
                ::operator+=((QString *)&local_2c8,
                             (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[2],_QString>,_const_char_(&)[2]>,_QString>
                              *)local_88);
                QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[2],_QString>,_const_char_(&)[2]>,_QString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[2],_QString>,_const_char_(&)[2]>,_QString>
                                   *)local_88);
                if ((QMakeProject *)local_388.a.d.d != (QMakeProject *)0x0) {
                  LOCK();
                  *(int *)&((DataPointer *)
                           &((QMakeEvaluator *)&(local_388.a.d.d)->super_QArrayData)->m_caller)->d =
                       *(int *)&((DataPointer *)
                                &((QMakeEvaluator *)&(local_388.a.d.d)->super_QArrayData)->m_caller)
                                ->d + -1;
                  UNLOCK();
                  if (*(int *)&((DataPointer *)
                               &((QMakeEvaluator *)&(local_388.a.d.d)->super_QArrayData)->m_caller)
                               ->d == 0) {
                    QArrayData::deallocate(&(local_388.a.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if ((QMakeProject *)local_358._0_8_ != (QMakeProject *)0x0) {
                  LOCK();
                  *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358._0_8_)->m_caller)->d =
                       *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358._0_8_)->m_caller)->d +
                       -1;
                  UNLOCK();
                  if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_358._0_8_)->m_caller)->d ==
                      0) {
                    QArrayData::deallocate((QArrayData *)local_358._0_8_,2,0x10);
                  }
                }
                local_2e8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_2e8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_2e8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                ProKey::ProKey((ProKey *)local_88,"QMAKE_INSTALL_REPLACE");
                QFileInfo::fileName();
                createSedArgs((QString *)local_2e8,this,(ProKey *)local_88,(QString *)local_358);
                if ((QMakeProject *)local_358._0_8_ != (QMakeProject *)0x0) {
                  LOCK();
                  *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358._0_8_)->m_caller)->d =
                       *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358._0_8_)->m_caller)->d +
                       -1;
                  UNLOCK();
                  if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_358._0_8_)->m_caller)->d ==
                      0) {
                    QArrayData::deallocate((QArrayData *)local_358._0_8_,2,0x10);
                  }
                }
                if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
                  LOCK();
                  ((__atomic_base<int> *)&(((QString *)local_88._0_8_)->d).d)->_M_i =
                       ((__atomic_base<int> *)&(((QString *)local_88._0_8_)->d).d)->_M_i + -1;
                  UNLOCK();
                  if (((__atomic_base<int> *)&(((QString *)local_88._0_8_)->d).d)->_M_i == 0) {
                    QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
                  }
                }
                if ((ProString *)local_2e8._16_8_ == (ProString *)0x0) {
                  QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                            ((QMovableArrayOps<QString> *)&local_1a8,local_1a8.size,
                             (QString *)&local_2c8);
                  QList<QString>::end((QList<QString> *)&local_1a8);
                }
                else {
                  (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                            (&local_388,this,&local_238);
                  qVar16 = local_388.a.d.size;
                  pcVar5 = local_388.a.d.ptr;
                  pDVar4 = local_388.a.d.d;
                  local_388.a.d.size = 0;
                  local_388.a.d.d = (Data *)0x0;
                  local_388.a.d.ptr = (char16_t *)0x0;
                  (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                            (&local_3d8,this,&local_2a8);
                  local_40 = (QMakeProject *)local_3d8.super_ProString.m_string.d.size;
                  pQStack_48 = (QMakeProject *)local_3d8.super_ProString.m_string.d.ptr;
                  local_50 = (QMakeProject *)local_3d8.super_ProString.m_string.d.d;
                  local_88._0_8_ = anon_var_dwarf_155db4;
                  local_88._8_8_ = local_2e8;
                  local_78.d._0_1_ = 0x20;
                  pQStack_70 = (QMakeProject *)pDVar4;
                  pQStack_68 = (QMakeProject *)pcVar5;
                  local_60 = (QMakeProject *)qVar16;
                  PStack_58.d.d.ptr =
                       (QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                        )((long)"\n\techo \"// Automatically generated, do not modify\" > " + 0x32);
                  local_3d8.super_ProString.m_string.d.d = (Data *)0x0;
                  local_3d8.super_ProString.m_string.d.ptr = (char16_t *)0x0;
                  local_3d8.super_ProString.m_string.d.size = 0;
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_QString_&>,_char>,_QString>,_const_char_(&)[4]>,_QString>
                  ::convertTo<QString>
                            ((QString *)local_358,
                             (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_QString_&>,_char>,_QString>,_const_char_(&)[4]>,_QString>
                              *)local_88);
                  QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                            ((QMovableArrayOps<QString> *)&local_1a8,local_1a8.size,
                             (QString *)local_358);
                  QList<QString>::end((QList<QString> *)&local_1a8);
                  if ((QMakeProject *)local_358._0_8_ != (QMakeProject *)0x0) {
                    LOCK();
                    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358._0_8_)->m_caller)->d =
                         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358._0_8_)->m_caller)->d
                         + -1;
                    UNLOCK();
                    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_358._0_8_)->m_caller)->d
                        == 0) {
                      QArrayData::deallocate((QArrayData *)local_358._0_8_,2,0x10);
                    }
                  }
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_QString_&>,_char>,_QString>,_const_char_(&)[4]>,_QString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_QString_&>,_char>,_QString>,_const_char_(&)[4]>,_QString>
                                     *)local_88);
                  if ((QMakeProject *)local_3d8.super_ProString.m_string.d.d != (QMakeProject *)0x0)
                  {
                    LOCK();
                    *(int *)&((DataPointer *)
                             &((QMakeEvaluator *)
                              &(local_3d8.super_ProString.m_string.d.d)->super_QArrayData)->m_caller
                             )->d =
                         *(int *)&((DataPointer *)
                                  &((QMakeEvaluator *)
                                   &(local_3d8.super_ProString.m_string.d.d)->super_QArrayData)->
                                   m_caller)->d + -1;
                    UNLOCK();
                    if (*(int *)&((DataPointer *)
                                 &((QMakeEvaluator *)
                                  &(local_3d8.super_ProString.m_string.d.d)->super_QArrayData)->
                                  m_caller)->d == 0) {
                      QArrayData::deallocate
                                (&(local_3d8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10)
                      ;
                    }
                  }
                  if ((QMakeProject *)local_388.a.d.d != (QMakeProject *)0x0) {
                    LOCK();
                    *(int *)&((DataPointer *)
                             &((QMakeEvaluator *)&(local_388.a.d.d)->super_QArrayData)->m_caller)->d
                         = *(int *)&((DataPointer *)
                                    &((QMakeEvaluator *)&(local_388.a.d.d)->super_QArrayData)->
                                     m_caller)->d + -1;
                    UNLOCK();
                    if (*(int *)&((DataPointer *)
                                 &((QMakeEvaluator *)&(local_388.a.d.d)->super_QArrayData)->m_caller
                                 )->d == 0) {
                      QArrayData::deallocate(&(local_388.a.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                }
                if (in_stack_fffffffffffffae7 == '\0') {
                  pQVar23 = this->project;
                  QVar38.m_data = (storage_type *)0xa;
                  QVar38.m_size = (qsizetype)local_88;
                  QString::fromUtf8(QVar38);
                  uVar6 = local_88._0_8_;
                  bVar13 = false;
                  config.m_data = (storage_type_conflict *)local_88._8_8_;
                  config.m_size = (qsizetype)local_78.d;
                  bVar12 = QMakeEvaluator::isActiveConfig
                                     (&pQVar23->super_QMakeEvaluator,config,false);
                  if (!bVar12) {
                    pQVar23 = this->project;
                    QVar39.m_data = (storage_type *)0x7;
                    QVar39.m_size = (qsizetype)local_88;
                    QString::fromUtf8(QVar39);
                    uVar7 = local_88._0_8_;
                    bVar13 = false;
                    config_00.m_data = (storage_type_conflict *)local_88._8_8_;
                    config_00.m_size = (qsizetype)local_78.d;
                    bVar12 = QMakeEvaluator::isActiveConfig
                                       (&pQVar23->super_QMakeEvaluator,config_00,false);
                    if (!bVar12) {
                      cVar10 = QFileInfo::isDir();
                      if ((cVar10 == '\0') && (cVar10 = QFileInfo::isExecutable(), cVar10 != '\0'))
                      {
                        pQVar23 = this->project;
                        ProKey::ProKey((ProKey *)local_88,"QMAKE_STRIP");
                        bVar13 = QMakeProject::isEmpty(pQVar23,(ProKey *)local_88);
                        if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
                          LOCK();
                          ((__atomic_base<int> *)&(((QString *)local_88._0_8_)->d).d)->_M_i =
                               ((__atomic_base<int> *)&(((QString *)local_88._0_8_)->d).d)->_M_i +
                               -1;
                          UNLOCK();
                          if (((__atomic_base<int> *)&(((QString *)local_88._0_8_)->d).d)->_M_i == 0
                             ) {
                            QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
                          }
                        }
                        bVar13 = !bVar13;
                      }
                      else {
                        bVar13 = false;
                      }
                    }
                    if ((ProString *)uVar7 != (ProString *)0x0) {
                      LOCK();
                      ((__atomic_base<int> *)&(((QString *)uVar7)->d).d)->_M_i =
                           ((__atomic_base<int> *)&(((QString *)uVar7)->d).d)->_M_i + -1;
                      UNLOCK();
                      if (((__atomic_base<int> *)&(((QString *)uVar7)->d).d)->_M_i == 0) {
                        QArrayData::deallocate((QArrayData *)uVar7,2,0x10);
                      }
                    }
                  }
                  if ((ProString *)uVar6 != (ProString *)0x0) {
                    LOCK();
                    ((__atomic_base<int> *)&(((QString *)uVar6)->d).d)->_M_i =
                         ((__atomic_base<int> *)&(((QString *)uVar6)->d).d)->_M_i + -1;
                    UNLOCK();
                    if (((__atomic_base<int> *)&(((QString *)uVar6)->d).d)->_M_i == 0) {
                      QArrayData::deallocate((QArrayData *)uVar6,2,0x10);
                    }
                  }
                  if (bVar13) {
                    QVar40.m_data = (storage_type *)0x1;
                    QVar40.m_size = (qsizetype)local_88;
                    QString::fromUtf8(QVar40);
                    QVar9.d = local_78.d;
                    uVar7 = local_88._8_8_;
                    uVar6 = local_88._0_8_;
                    ProKey::ProKey(&local_3d8,"QMAKE_STRIP");
                    (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x16])
                              (&local_3a8,this,&local_3d8);
                    local_330 = (QMakeProject *)local_3a8.d.size;
                    pQStack_338 = (QMakeProject *)local_3a8.d.ptr;
                    local_340 = local_3a8.d.d;
                    local_3a8.d.size = 0;
                    local_388.a.d.d = (Data *)0x0;
                    local_388.a.d.ptr = (char16_t *)0x0;
                    local_358._0_8_ = uVar6;
                    local_358._8_8_ = uVar7;
                    local_388.a.d.size = 0;
                    local_358._16_8_ = QVar9.d;
                    local_388.b.d.d = (Data *)0x0;
                    local_388.b.d.ptr = (char16_t *)0x0;
                    local_3a8.d.d = (Data *)0x0;
                    local_3a8.d.ptr = (char16_t *)0x0;
                    local_388.b.d.size = 0;
                    QStack_328.d.ptr =
                         (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                          )(QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>
                            *)0x2b1f52;
                    local_488.d.d = (Data *)local_288;
                    local_488.d.ptr = (char16_t *)local_270;
                    QStringBuilder<QString_&,_QString_&>::convertTo<QString>
                              ((QString *)(local_458 + 8),
                               (QStringBuilder<QString_&,_QString_&> *)&local_488);
                    pMVar27 = this;
                    fileFixify(&local_438,this,(QString *)(local_458 + 8),(FileFixifyTypes)0x4,false
                              );
                    filePrefixRoot(&local_418,pMVar27,&local_148,&local_438);
                    (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                              (&local_3f8,this,&local_418);
                    local_60 = local_330;
                    pQStack_68 = pQStack_338;
                    pQStack_70 = (QMakeProject *)local_340;
                    local_78.d = (Data *)local_358._16_8_;
                    local_88._8_8_ = local_358._8_8_;
                    local_88._0_8_ = local_358._0_8_;
                    local_40 = (QMakeProject *)local_3f8.d.size;
                    pQStack_48 = (QMakeProject *)local_3f8.d.ptr;
                    local_50 = (QMakeProject *)local_3f8.d.d;
                    local_358._0_8_ = (QMakeProject *)0x0;
                    local_358._8_8_ = (QMakeProject *)0x0;
                    local_358._16_8_ = (QMakeProject *)0x0;
                    local_340 = (Data *)0x0;
                    pQStack_338 = (QMakeProject *)0x0;
                    local_330 = (QMakeProject *)0x0;
                    PStack_58.d.d.ptr =
                         (QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                          )(QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                            )QStack_328.d.ptr;
                    local_3f8.d.d = (Data *)0x0;
                    local_3f8.d.ptr = (char16_t *)0x0;
                    local_3f8.d.size = 0;
                    QStringBuilder<QStringBuilder<QStringBuilder<QString,_QString>,_const_char_(&)[2]>,_QString>
                    ::convertTo<QString>
                              (&local_318,
                               (QStringBuilder<QStringBuilder<QStringBuilder<QString,_QString>,_const_char_(&)[2]>,_QString>
                                *)local_88);
                    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                              ((QMovableArrayOps<QString> *)&local_1a8,local_1a8.size,&local_318);
                    QList<QString>::end((QList<QString> *)&local_1a8);
                    if (&(local_318.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_318.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_318.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_318.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        QArrayData::deallocate(&(local_318.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    QStringBuilder<QStringBuilder<QStringBuilder<QString,_QString>,_const_char_(&)[2]>,_QString>
                    ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QString,_QString>,_const_char_(&)[2]>,_QString>
                                       *)local_88);
                    if (&(local_3f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_3f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_3f8.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_3f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        QArrayData::deallocate(&(local_3f8.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    if ((QMakeProject *)local_418.d.d != (QMakeProject *)0x0) {
                      LOCK();
                      *(int *)&((DataPointer *)
                               &((QMakeEvaluator *)&(local_418.d.d)->super_QArrayData)->m_caller)->d
                           = *(int *)&((DataPointer *)
                                      &((QMakeEvaluator *)&(local_418.d.d)->super_QArrayData)->
                                       m_caller)->d + -1;
                      UNLOCK();
                      if (*(int *)&((DataPointer *)
                                   &((QMakeEvaluator *)&(local_418.d.d)->super_QArrayData)->m_caller
                                   )->d == 0) {
                        QArrayData::deallocate(&(local_418.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    if ((QMakeProject *)local_438.d.d != (QMakeProject *)0x0) {
                      LOCK();
                      *(int *)&((DataPointer *)
                               &((QMakeEvaluator *)&(local_438.d.d)->super_QArrayData)->m_caller)->d
                           = *(int *)&((DataPointer *)
                                      &((QMakeEvaluator *)&(local_438.d.d)->super_QArrayData)->
                                       m_caller)->d + -1;
                      UNLOCK();
                      if (*(int *)&((DataPointer *)
                                   &((QMakeEvaluator *)&(local_438.d.d)->super_QArrayData)->m_caller
                                   )->d == 0) {
                        QArrayData::deallocate(&(local_438.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    if ((QArrayData *)local_458._8_8_ != (QArrayData *)0x0) {
                      LOCK();
                      (((QBasicAtomicInt *)local_458._8_8_)->_q_value).super___atomic_base<int>._M_i
                           = (((QBasicAtomicInt *)local_458._8_8_)->_q_value).
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if ((((QBasicAtomicInt *)local_458._8_8_)->_q_value).super___atomic_base<int>.
                          _M_i == 0) {
                        QArrayData::deallocate((QArrayData *)local_458._8_8_,2,0x10);
                      }
                    }
                    QStringBuilder<QString,_QString>::~QStringBuilder
                              ((QStringBuilder<QString,_QString> *)local_358);
                    QStringBuilder<QString,_QString>::~QStringBuilder(&local_388);
                    if ((QMakeProject *)local_3a8.d.d != (QMakeProject *)0x0) {
                      LOCK();
                      *(int *)&((DataPointer *)
                               &((QMakeEvaluator *)&(local_3a8.d.d)->super_QArrayData)->m_caller)->d
                           = *(int *)&((DataPointer *)
                                      &((QMakeEvaluator *)&(local_3a8.d.d)->super_QArrayData)->
                                       m_caller)->d + -1;
                      UNLOCK();
                      if (*(int *)&((DataPointer *)
                                   &((QMakeEvaluator *)&(local_3a8.d.d)->super_QArrayData)->m_caller
                                   )->d == 0) {
                        QArrayData::deallocate(&(local_3a8.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    if ((QMakeProject *)local_3d8.super_ProString.m_string.d.d !=
                        (QMakeProject *)0x0) {
                      LOCK();
                      *(int *)&((DataPointer *)
                               &((QMakeEvaluator *)
                                &(local_3d8.super_ProString.m_string.d.d)->super_QArrayData)->
                                m_caller)->d =
                           *(int *)&((DataPointer *)
                                    &((QMakeEvaluator *)
                                     &(local_3d8.super_ProString.m_string.d.d)->super_QArrayData)->
                                     m_caller)->d + -1;
                      UNLOCK();
                      if (*(int *)&((DataPointer *)
                                   &((QMakeEvaluator *)
                                    &(local_3d8.super_ProString.m_string.d.d)->super_QArrayData)->
                                    m_caller)->d == 0) {
                        QArrayData::deallocate
                                  (&(local_3d8.super_ProString.m_string.d.d)->super_QArrayData,2,
                                   0x10);
                      }
                    }
                  }
                }
                local_3f8.d.d = (Data *)local_288;
                local_3f8.d.ptr = (char16_t *)local_270;
                QStringBuilder<QString_&,_QString_&>::convertTo<QString>
                          (&local_3a8,(QStringBuilder<QString_&,_QString_&> *)&local_3f8);
                pMVar27 = this;
                fileFixify(&local_318,this,&local_3a8,(FileFixifyTypes)0x4,false);
                filePrefixRoot((QString *)&local_3d8,pMVar27,&local_148,&local_318);
                (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                          (&local_388,this,&local_3d8);
                pQStack_68 = (QMakeProject *)local_388.a.d.size;
                pQStack_70 = (QMakeProject *)local_388.a.d.ptr;
                local_78.d = (Data *)local_388.a.d.d;
                local_88._0_8_ = local_a8;
                local_88._8_8_ = " ";
                local_388.a.d.d = (Data *)0x0;
                local_388.a.d.ptr = (char16_t *)0x0;
                local_388.a.d.size = 0;
                QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString>::
                convertTo<QString>((QString *)local_358,
                                   (QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString>
                                    *)local_88);
                QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                          ((QMovableArrayOps<QString> *)&local_1c8,local_1c8.size,
                           (QString *)local_358);
                QList<QString>::end((QList<QString> *)&local_1c8);
                if ((QMakeProject *)local_358._0_8_ != (QMakeProject *)0x0) {
                  LOCK();
                  *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358._0_8_)->m_caller)->d =
                       *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358._0_8_)->m_caller)->d +
                       -1;
                  UNLOCK();
                  if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_358._0_8_)->m_caller)->d ==
                      0) {
                    QArrayData::deallocate((QArrayData *)local_358._0_8_,2,0x10);
                  }
                }
                if ((QMakeProject *)local_78.d != (QMakeProject *)0x0) {
                  LOCK();
                  *(int *)&((DataPointer *)&((QMakeEvaluator *)&(local_78.d)->ref)->m_caller)->d =
                       *(int *)&((DataPointer *)&((QMakeEvaluator *)&(local_78.d)->ref)->m_caller)->
                                d + -1;
                  UNLOCK();
                  if (*(int *)&((DataPointer *)&((QMakeEvaluator *)&(local_78.d)->ref)->m_caller)->d
                      == 0) {
                    QArrayData::deallocate((QArrayData *)local_78.d,2,0x10);
                  }
                }
                if ((QMakeProject *)local_388.a.d.d != (QMakeProject *)0x0) {
                  LOCK();
                  *(int *)&((DataPointer *)
                           &((QMakeEvaluator *)&(local_388.a.d.d)->super_QArrayData)->m_caller)->d =
                       *(int *)&((DataPointer *)
                                &((QMakeEvaluator *)&(local_388.a.d.d)->super_QArrayData)->m_caller)
                                ->d + -1;
                  UNLOCK();
                  if (*(int *)&((DataPointer *)
                               &((QMakeEvaluator *)&(local_388.a.d.d)->super_QArrayData)->m_caller)
                               ->d == 0) {
                    QArrayData::deallocate(&(local_388.a.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if ((QMakeProject *)local_3d8.super_ProString.m_string.d.d != (QMakeProject *)0x0) {
                  LOCK();
                  *(int *)&((DataPointer *)
                           &((QMakeEvaluator *)
                            &(local_3d8.super_ProString.m_string.d.d)->super_QArrayData)->m_caller)
                           ->d = *(int *)&((DataPointer *)
                                          &((QMakeEvaluator *)
                                           &(local_3d8.super_ProString.m_string.d.d)->
                                            super_QArrayData)->m_caller)->d + -1;
                  UNLOCK();
                  if (*(int *)&((DataPointer *)
                               &((QMakeEvaluator *)
                                &(local_3d8.super_ProString.m_string.d.d)->super_QArrayData)->
                                m_caller)->d == 0) {
                    QArrayData::deallocate
                              (&(local_3d8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (&(local_318.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_318.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_318.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_318.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i == 0) {
                    QArrayData::deallocate(&(local_318.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if ((QMakeProject *)local_3a8.d.d != (QMakeProject *)0x0) {
                  LOCK();
                  *(int *)&((DataPointer *)
                           &((QMakeEvaluator *)&(local_3a8.d.d)->super_QArrayData)->m_caller)->d =
                       *(int *)&((DataPointer *)
                                &((QMakeEvaluator *)&(local_3a8.d.d)->super_QArrayData)->m_caller)->
                                d + -1;
                  UNLOCK();
                  if (*(int *)&((DataPointer *)
                               &((QMakeEvaluator *)&(local_3a8.d.d)->super_QArrayData)->m_caller)->d
                      == 0) {
                    QArrayData::deallocate(&(local_3a8.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if ((QMakeProject *)local_2e8._0_8_ != (QMakeProject *)0x0) {
                  LOCK();
                  *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2e8._0_8_)->m_caller)->d =
                       *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2e8._0_8_)->m_caller)->d +
                       -1;
                  UNLOCK();
                  if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_2e8._0_8_)->m_caller)->d ==
                      0) {
                    QArrayData::deallocate((QArrayData *)local_2e8._0_8_,2,0x10);
                  }
                }
                if ((QMakeGlobals *)local_2c8.d != (QMakeGlobals *)0x0) {
                  LOCK();
                  *(int *)local_2c8.d = *(int *)local_2c8.d + -1;
                  UNLOCK();
                  if (*(int *)local_2c8.d == 0) {
                    QArrayData::deallocate(&(local_2c8.d)->super_QArrayData,2,0x10);
                  }
                }
                if (&(local_2a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_2a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_2a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_2a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i == 0) {
                    QArrayData::deallocate(&(local_2a8.d.d)->super_QArrayData,2,0x10);
                  }
                }
                QFileInfo::~QFileInfo((QFileInfo *)local_4a0);
              }
              if ((QMakeProject *)local_288._0_8_ != (QMakeProject *)0x0) {
                LOCK();
                *(int *)&((DataPointer *)&((QMakeEvaluator *)local_288._0_8_)->m_caller)->d =
                     *(int *)&((DataPointer *)&((QMakeEvaluator *)local_288._0_8_)->m_caller)->d +
                     -1;
                UNLOCK();
                if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_288._0_8_)->m_caller)->d == 0
                   ) {
                  QArrayData::deallocate((QArrayData *)local_288._0_8_,2,0x10);
                }
              }
              if ((QMakeProject *)local_270._0_8_ != (QMakeProject *)0x0) {
                LOCK();
                *(int *)&((DataPointer *)&((QMakeEvaluator *)local_270._0_8_)->m_caller)->d =
                     *(int *)&((DataPointer *)&((QMakeEvaluator *)local_270._0_8_)->m_caller)->d +
                     -1;
                UNLOCK();
                if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_270._0_8_)->m_caller)->d == 0
                   ) {
                  QArrayData::deallocate((QArrayData *)local_270._0_8_,2,0x10);
                }
              }
              if ((QMakeProject *)local_258._0_8_ != (QMakeProject *)0x0) {
                LOCK();
                *(int *)&((DataPointer *)&((QMakeEvaluator *)local_258._0_8_)->m_caller)->d =
                     *(int *)&((DataPointer *)&((QMakeEvaluator *)local_258._0_8_)->m_caller)->d +
                     -1;
                UNLOCK();
                if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_258._0_8_)->m_caller)->d == 0
                   ) {
                  QArrayData::deallocate((QArrayData *)local_258._0_8_,2,0x10);
                }
              }
              if ((totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                   )local_238.d.d !=
                  (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                   )0x0) {
                LOCK();
                *(int *)local_238.d.d = *(int *)local_238.d.d + -1;
                UNLOCK();
                if (*(int *)local_238.d.d == 0) {
                  QArrayData::deallocate(&(local_238.d.d)->super_QArrayData,2,0x10);
                }
              }
              iVar18.i = iVar18.i + 1;
              iVar19 = QList<QString>::end((QList<QString> *)&local_188);
            } while (iVar18.i != iVar19.i);
          }
          if ((QMakeProject *)local_218.d.d != (QMakeProject *)0x0) {
            LOCK();
            *(int *)&((DataPointer *)
                     &((QMakeEvaluator *)&(local_218.d.d)->super_QArrayData)->m_caller)->d =
                 *(int *)&((DataPointer *)
                          &((QMakeEvaluator *)&(local_218.d.d)->super_QArrayData)->m_caller)->d + -1
            ;
            UNLOCK();
            if (*(int *)&((DataPointer *)
                         &((QMakeEvaluator *)&(local_218.d.d)->super_QArrayData)->m_caller)->d == 0)
            {
              QArrayData::deallocate(&(local_218.d.d)->super_QArrayData,2,0x10);
            }
          }
LAB_0016a72e:
          local_358._16_8_ = (QMakeProject *)0x0;
          local_358._8_8_ = (QMakeProject *)0x0;
          local_358._0_8_ = (QMakeProject *)0x0;
          QVar44.m_data = (storage_type *)0x2;
          QVar44.m_size = (qsizetype)local_88;
          QString::fromUtf8(QVar44);
          pQVar23 = (QMakeProject *)local_88._0_8_;
          pQVar30 = (QMakeProject *)local_88._8_8_;
          if ((QMakeProject *)local_88._8_8_ == (QMakeProject *)0x0) {
            pQVar30 = (QMakeProject *)&QString::_empty;
          }
          QtPrivate::QStringList_join((QList *)local_88,(QChar *)&local_1a8,(longlong)pQVar30);
          QVar9.d = local_78.d;
          uVar8 = local_88._0_8_;
          uVar7 = local_358._8_8_;
          uVar6 = local_358._0_8_;
          local_88._0_8_ = local_358._0_8_;
          local_358._0_8_ = uVar8;
          local_358._8_8_ = local_88._8_8_;
          local_88._8_8_ = uVar7;
          local_78.d = (Data *)local_358._16_8_;
          local_358._16_8_ = QVar9.d;
          if ((QMakeProject *)uVar6 != (QMakeProject *)0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)uVar6)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)uVar6)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)uVar6)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)uVar6,2,0x10);
            }
          }
          if (pQVar23 != (QMakeProject *)0x0) {
            LOCK();
            *(int *)&((DataPointer *)&(pQVar23->super_QMakeEvaluator).m_caller)->d =
                 *(int *)&((DataPointer *)&(pQVar23->super_QMakeEvaluator).m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&(pQVar23->super_QMakeEvaluator).m_caller)->d == 0) {
LAB_0016a7f4:
              QArrayData::deallocate((QArrayData *)pQVar23,2,0x10);
            }
          }
        }
LAB_0016a7f9:
        local_388.a.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_388.a.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_388.a.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        pQVar23 = this->project;
        local_3d8.super_ProString.m_string.d.ptr = L".uninstall";
        local_3d8.super_ProString.m_string.d.d = (Data *)pQVar26;
        ProString::ProString<ProString_const&,char_const(&)[11]>
                  ((ProString *)local_88,
                   (QStringBuilder<const_ProString_&,_const_char_(&)[11]> *)&local_3d8);
        pPVar17 = QMakeEvaluator::valuesRef(&pQVar23->super_QMakeEvaluator,(ProKey *)local_88);
        ProStringList::join(&local_388.a,pPVar17,(QChar)0x20);
        if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
          }
        }
        if ((Data *)local_388.a.d.size != (Data *)0x0) {
          QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                    ((QMovableArrayOps<QString> *)&local_1c8,local_1c8.size,&local_388.a);
          QList<QString>::end((QList<QString> *)&local_1c8);
        }
        pQVar23 = pQVar26;
        if (((QMakeProject *)local_358._16_8_ == (QMakeProject *)0x0) &&
           (qVar16 = QtPrivate::indexOf<ProString,char[14]>(vector,(char (*) [14])"dummy_install",0)
           , qVar16 == -1)) {
          if (Option::debug_level != 0) {
            ProString::toLatin1((QByteArray *)local_88,(ProString *)pQVar26);
            pQVar23 = (QMakeProject *)local_88._8_8_;
            if ((QMakeProject *)local_88._8_8_ == (QMakeProject *)0x0) {
              pQVar23 = (QMakeProject *)&QByteArray::_empty;
            }
            debug_msg_internal(1,"no definition for install %s: install target not created",pQVar23)
            ;
            if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
              LOCK();
              *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
                   *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d + -1;
              UNLOCK();
              if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d == 0) {
                QArrayData::deallocate((QArrayData *)local_88._0_8_,1,0x10);
              }
            }
          }
        }
        else {
          if ((noBuild) ||
             (qVar16 = QtPrivate::indexOf<ProString,char[9]>(vector,(char (*) [9])"no_build",0),
             qVar16 != -1)) {
            pQVar22 = (QTextStream *)QTextStream::operator<<(t,anon_var_dwarf_155e77 + 2);
            pQVar22 = operator<<(pQVar22,(ProString *)pQVar26);
            QTextStream::operator<<(pQVar22,":");
          }
          else {
            pQVar26 = this->project;
            QVar46.m_data = (storage_type *)0x9;
            QVar46.m_size = (qsizetype)local_88;
            QString::fromUtf8(QVar46);
            uVar6 = local_88._0_8_;
            config_03.m_data = (storage_type_conflict *)local_88._8_8_;
            config_03.m_size = (qsizetype)local_78.d;
            bVar13 = QMakeEvaluator::isActiveConfig(&pQVar26->super_QMakeEvaluator,config_03,false);
            pQVar26 = pQVar23;
            if ((QMakeProject *)uVar6 != (QMakeProject *)0x0) {
              LOCK();
              *(int *)&((DataPointer *)&((QMakeEvaluator *)uVar6)->m_caller)->d =
                   *(int *)&((DataPointer *)&((QMakeEvaluator *)uVar6)->m_caller)->d + -1;
              UNLOCK();
              if (*(int *)&((DataPointer *)&((QMakeEvaluator *)uVar6)->m_caller)->d == 0) {
                QArrayData::deallocate((QArrayData *)uVar6,2,0x10);
                pQVar26 = pQVar23;
              }
            }
            pQVar22 = (QTextStream *)QTextStream::operator<<(t,anon_var_dwarf_155e77 + 2);
            pQVar22 = operator<<(pQVar22,(ProString *)pQVar26);
            if (bVar13) {
              pcVar28 = ": all";
            }
            else {
              pcVar28 = ": first";
            }
            QTextStream::operator<<(pQVar22,pcVar28);
            pQVar23 = pQVar26;
          }
          pQVar30 = this->project;
          local_3d8.super_ProString.m_string.d.ptr = L".depends";
          local_3d8.super_ProString.m_string.d.d = (Data *)pQVar26;
          ProString::ProString<ProString_const&,char_const(&)[9]>
                    ((ProString *)local_88,
                     (QStringBuilder<const_ProString_&,_const_char_(&)[9]> *)&local_3d8);
          pPVar17 = QMakeEvaluator::valuesRef(&pQVar30->super_QMakeEvaluator,(ProKey *)local_88);
          pQVar26 = pQVar23;
          if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
              pQVar26 = pQVar23;
            }
          }
          if ((pPVar17->super_QList<ProString>).d.size != 0) {
            pQVar23 = (QMakeProject *)(pPVar17->super_QList<ProString>).d.ptr;
            do {
              local_3d8.super_ProString.m_string.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              local_3d8.super_ProString.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              local_3d8.super_ProString.m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
              local_218.d.ptr = L".target";
              local_218.d.d = (Data *)pQVar23;
              ProString::ProString<ProString_const&,char_const(&)[8]>
                        ((ProString *)local_88,
                         (QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)&local_218);
              (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x16])
                        (&local_3d8,this,(ProString *)local_88);
              if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
                LOCK();
                *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
                     *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d + -1
                ;
                UNLOCK();
                if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d == 0)
                {
                  QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
                }
              }
              if ((QMakeProject *)local_3d8.super_ProString.m_string.d.size == (QMakeProject *)0x0)
              {
                ProString::toQString((QString *)local_88,(ProString *)pQVar23);
                QVar9.d = local_78.d;
                uVar6 = local_88._0_8_;
                pcVar5 = local_3d8.super_ProString.m_string.d.ptr;
                pDVar4 = local_3d8.super_ProString.m_string.d.d;
                local_88._0_8_ = local_3d8.super_ProString.m_string.d.d;
                pQVar1 = (QMakeProject *)local_3d8.super_ProString.m_string.d.ptr;
                pQVar2 = (QMakeProject *)local_3d8.super_ProString.m_string.d.size;
                local_3d8.super_ProString.m_string.d.d = (Data *)uVar6;
                local_3d8.super_ProString.m_string.d.ptr = (char16_t *)local_88._8_8_;
                pQVar30 = (QMakeProject *)local_78.d;
                local_88._8_8_ = pcVar5;
                local_78.d = (Data *)local_3d8.super_ProString.m_string.d.size;
                local_3d8.super_ProString.m_string.d.size = (qsizetype)QVar9.d;
                if ((QMakeProject *)pDVar4 != (QMakeProject *)0x0) {
                  LOCK();
                  *(int *)&((DataPointer *)&((QMakeEvaluator *)&pDVar4->super_QArrayData)->m_caller)
                           ->d = *(int *)&((DataPointer *)
                                          &((QMakeEvaluator *)&pDVar4->super_QArrayData)->m_caller)
                                          ->d + -1;
                  UNLOCK();
                  if (*(int *)&((DataPointer *)
                               &((QMakeEvaluator *)&pDVar4->super_QArrayData)->m_caller)->d == 0) {
                    QArrayData::deallocate(&pDVar4->super_QArrayData,2,0x10);
                  }
                }
              }
              pQVar22 = (QTextStream *)QTextStream::operator<<(t," ");
              (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xd])
                        (local_88,this,&local_3d8);
              QTextStream::operator<<(pQVar22,(QString *)local_88);
              if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
                LOCK();
                *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
                     *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d + -1
                ;
                UNLOCK();
                if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d == 0)
                {
                  QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
                }
              }
              if ((QMakeProject *)local_3d8.super_ProString.m_string.d.d != (QMakeProject *)0x0) {
                LOCK();
                *(int *)&((DataPointer *)
                         &((QMakeEvaluator *)
                          &(local_3d8.super_ProString.m_string.d.d)->super_QArrayData)->m_caller)->d
                     = *(int *)&((DataPointer *)
                                &((QMakeEvaluator *)
                                 &(local_3d8.super_ProString.m_string.d.d)->super_QArrayData)->
                                 m_caller)->d + -1;
                UNLOCK();
                if (*(int *)&((DataPointer *)
                             &((QMakeEvaluator *)
                              &(local_3d8.super_ProString.m_string.d.d)->super_QArrayData)->m_caller
                             )->d == 0) {
                  QArrayData::deallocate
                            (&(local_3d8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
                }
              }
              pQVar23 = (QMakeProject *)
                        &(pQVar23->super_QMakeEvaluator).m_locationStack.
                         super_QList<QMakeEvaluator::Location>.d.size;
            } while (pQVar23 !=
                     (QMakeProject *)
                     ((pPVar17->super_QList<ProString>).d.ptr +
                     (pPVar17->super_QList<ProString>).d.size));
          }
          QTextStream::operator<<(t," FORCE\n\t");
          pPVar17 = QMakeEvaluator::valuesRef
                              (&this->project->super_QMakeEvaluator,(ProKey *)local_128);
          if ((pPVar17->super_QList<ProString>).d.size != 0) {
            this_00 = (pPVar17->super_QList<ProString>).d.ptr;
            do {
              local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
              ProString::toQString((QString *)&local_3d8,this_00);
              pMVar27 = this;
              fileFixify((QString *)local_88,this,(QString *)&local_3d8,(FileFixifyTypes)0x4,false);
              if ((QMakeProject *)local_3d8.super_ProString.m_string.d.d != (QMakeProject *)0x0) {
                LOCK();
                *(int *)&((DataPointer *)
                         &((QMakeEvaluator *)
                          &(local_3d8.super_ProString.m_string.d.d)->super_QArrayData)->m_caller)->d
                     = *(int *)&((DataPointer *)
                                &((QMakeEvaluator *)
                                 &(local_3d8.super_ProString.m_string.d.d)->super_QArrayData)->
                                 m_caller)->d + -1;
                UNLOCK();
                if (*(int *)&((DataPointer *)
                             &((QMakeEvaluator *)
                              &(local_3d8.super_ProString.m_string.d.d)->super_QArrayData)->m_caller
                             )->d == 0) {
                  pMVar27 = (MakefileGenerator *)0x2;
                  QArrayData::deallocate
                            (&(local_3d8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
                }
              }
              filePrefixRoot(&local_218,pMVar27,&local_148,(QString *)local_88);
              mkdir_p_asstring((QString *)&local_3d8,this,&local_218,true);
              pQVar22 = (QTextStream *)QTextStream::operator<<(t,(QString *)&local_3d8);
              QTextStream::operator<<(pQVar22,"\n\t");
              if ((QMakeProject *)local_3d8.super_ProString.m_string.d.d != (QMakeProject *)0x0) {
                LOCK();
                *(int *)&((DataPointer *)
                         &((QMakeEvaluator *)
                          &(local_3d8.super_ProString.m_string.d.d)->super_QArrayData)->m_caller)->d
                     = *(int *)&((DataPointer *)
                                &((QMakeEvaluator *)
                                 &(local_3d8.super_ProString.m_string.d.d)->super_QArrayData)->
                                 m_caller)->d + -1;
                UNLOCK();
                if (*(int *)&((DataPointer *)
                             &((QMakeEvaluator *)
                              &(local_3d8.super_ProString.m_string.d.d)->super_QArrayData)->m_caller
                             )->d == 0) {
                  QArrayData::deallocate
                            (&(local_3d8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
                }
              }
              if ((QMakeProject *)local_218.d.d != (QMakeProject *)0x0) {
                LOCK();
                *(int *)&((DataPointer *)
                         &((QMakeEvaluator *)&(local_218.d.d)->super_QArrayData)->m_caller)->d =
                     *(int *)&((DataPointer *)
                              &((QMakeEvaluator *)&(local_218.d.d)->super_QArrayData)->m_caller)->d
                     + -1;
                UNLOCK();
                if (*(int *)&((DataPointer *)
                             &((QMakeEvaluator *)&(local_218.d.d)->super_QArrayData)->m_caller)->d
                    == 0) {
                  QArrayData::deallocate(&(local_218.d.d)->super_QArrayData,2,0x10);
                }
              }
              if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
                LOCK();
                *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
                     *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d + -1
                ;
                UNLOCK();
                if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d == 0)
                {
                  QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
                }
              }
              this_00 = this_00 + 1;
            } while (this_00 !=
                     (pPVar17->super_QList<ProString>).d.ptr +
                     (pPVar17->super_QList<ProString>).d.size);
          }
          pQVar22 = (QTextStream *)QTextStream::operator<<(t,(QString *)local_358);
          pQVar22 = (QTextStream *)Qt::endl(pQVar22);
          Qt::endl(pQVar22);
          if ((char16_t *)local_1c8.size != (char16_t *)0x0) {
            pQVar23 = pQVar26;
            pQVar22 = (QTextStream *)QTextStream::operator<<(t,anon_var_dwarf_155e77);
            pQVar22 = operator<<(pQVar22,(ProString *)pQVar26);
            QTextStream::operator<<(pQVar22,": FORCE");
            pQVar26 = pQVar23;
            if (0 < (int)(uint)local_1c8.size) {
              uVar24 = (ulong)((uint)local_1c8.size & 0x7fffffff);
              uVar25 = uVar24 + 1;
              lVar32 = uVar24 * 0x18;
              do {
                pQVar22 = (QTextStream *)QTextStream::operator<<(t,"\n\t");
                QTextStream::operator<<(pQVar22,(QString *)((long)&local_1c8.ptr[-1].d.d + lVar32));
                uVar25 = uVar25 - 1;
                lVar32 = lVar32 + -0x18;
              } while (1 < uVar25);
            }
            pcVar28 = "\n\t-$(DEL_DIR) ";
            pQVar22 = (QTextStream *)QTextStream::operator<<(t,"\n\t-$(DEL_DIR) ");
            filePrefixRoot((QString *)&local_3d8,(MakefileGenerator *)pcVar28,&local_148,&local_168)
            ;
            (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                      (local_88,this,&local_3d8);
            pQVar22 = (QTextStream *)QTextStream::operator<<(pQVar22,(QString *)local_88);
            QTextStream::operator<<(pQVar22," \n\n");
            if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
              LOCK();
              *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
                   *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d + -1;
              UNLOCK();
              if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d == 0) {
                QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
              }
            }
            if ((QMakeProject *)local_3d8.super_ProString.m_string.d.d != (QMakeProject *)0x0) {
              LOCK();
              *(int *)&((DataPointer *)
                       &((QMakeEvaluator *)
                        &(local_3d8.super_ProString.m_string.d.d)->super_QArrayData)->m_caller)->d =
                   *(int *)&((DataPointer *)
                            &((QMakeEvaluator *)
                             &(local_3d8.super_ProString.m_string.d.d)->super_QArrayData)->m_caller)
                            ->d + -1;
              UNLOCK();
              if (*(int *)&((DataPointer *)
                           &((QMakeEvaluator *)
                            &(local_3d8.super_ProString.m_string.d.d)->super_QArrayData)->m_caller)
                           ->d == 0) {
                QArrayData::deallocate
                          (&(local_3d8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
              }
            }
          }
          Qt::endl(t);
          qVar16 = QtPrivate::indexOf<ProString,char[19]>
                             (vector,(char (*) [19])"no_default_install",0);
          if (qVar16 == -1) {
            QVar45.m_data = &DAT_00000008;
            QVar45.m_size = (qsizetype)local_88;
            QString::fromUtf8(QVar45);
            pQStack_68 = (QMakeProject *)0x2b1f52;
            pQStack_70 = pQVar26;
            ::operator+=(&local_c8,
                         (QStringBuilder<QStringBuilder<QString,_const_ProString_&>,_const_char_(&)[2]>
                          *)local_88);
            if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
              LOCK();
              *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
                   *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d + -1;
              UNLOCK();
              if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d == 0) {
                QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
              }
            }
            if ((char16_t *)local_1c8.size != (char16_t *)0x0) {
              local_88._0_8_ = anon_var_dwarf_155e77;
              local_78.d = (Data *)0x2b1f52;
              local_88._8_8_ = pQVar26;
              ::operator+=(&local_e8,
                           (QStringBuilder<QStringBuilder<const_char_(&)[11],_const_ProString_&>,_const_char_(&)[2]>
                            *)local_88);
            }
          }
        }
        if (&(local_388.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_388.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_388.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
               -1;
          UNLOCK();
          if (((local_388.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
             ) {
            QArrayData::deallocate(&(local_388.a.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((QMakeProject *)local_358._0_8_ != (QMakeProject *)0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358._0_8_)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358._0_8_)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_358._0_8_)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_358._0_8_,2,0x10);
          }
        }
        QArrayDataPointer<ProString>::~QArrayDataPointer(&local_1e8);
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_1c8);
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_1a8);
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_188);
        if ((QMakeProject *)local_168.d.d != (QMakeProject *)0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)&(local_168.d.d)->super_QArrayData)->m_caller
                   )->d =
               *(int *)&((DataPointer *)
                        &((QMakeEvaluator *)&(local_168.d.d)->super_QArrayData)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)
                       &((QMakeEvaluator *)&(local_168.d.d)->super_QArrayData)->m_caller)->d == 0) {
            QArrayData::deallocate(&(local_168.d.d)->super_QArrayData,2,0x10);
          }
        }
        piVar3 = (int *)CONCAT44(local_148.d.d._4_4_,local_148.d.d._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            lVar29 = 2;
            pQVar23 = (QMakeProject *)CONCAT44(local_148.d.d._4_4_,local_148.d.d._0_4_);
            goto LAB_0016b18f;
          }
        }
      }
      if ((QArrayData *)local_128._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_128._0_8_,2,0x10);
        }
      }
      pQVar26 = (QMakeProject *)
                &(pQVar26->super_QMakeEvaluator).m_locationStack.
                 super_QList<QMakeEvaluator::Location>.d.size;
    } while (pQVar26 !=
             (QMakeProject *)
             ((pPVar15->super_QList<ProString>).d.ptr + (pPVar15->super_QList<ProString>).d.size));
  }
  pQVar22 = (QTextStream *)QTextStream::operator<<(t,"install:");
  ProKey::ProKey((ProKey *)local_88,"INSTALLDEPS");
  depVar((QString *)local_128,this,(ProKey *)local_88);
  pQVar22 = (QTextStream *)QTextStream::operator<<(pQVar22,(QString *)local_128);
  pQVar22 = (QTextStream *)QTextStream::operator<<(pQVar22,' ');
  pQVar22 = (QTextStream *)QTextStream::operator<<(pQVar22,(QString *)&local_c8);
  pQVar22 = (QTextStream *)QTextStream::operator<<(pQVar22," FORCE\n\nuninstall: ");
  pQVar22 = (QTextStream *)QTextStream::operator<<(pQVar22,(QString *)&local_e8);
  ProKey::ProKey((ProKey *)local_358,"UNINSTALLDEPS");
  depVar(&local_388.a,this,(ProKey *)local_358);
  pQVar22 = (QTextStream *)QTextStream::operator<<(pQVar22,(QString *)&local_388);
  QTextStream::operator<<(pQVar22," FORCE\n\n");
  if (&(local_388.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_388.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_388.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_388.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_388.a.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QMakeProject *)local_358._0_8_ != (QMakeProject *)0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358._0_8_)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358._0_8_)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_358._0_8_)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_358._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_128._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_128._0_8_,2,0x10);
    }
  }
  if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
    }
  }
  QHash<QString,_QHashDummyValue>::~QHash(&local_f8);
  QHash<QString,_QHashDummyValue>::~QHash(&local_f0);
  if ((QMakeFeatureRoots *)local_e8.d.d != (QMakeFeatureRoots *)0x0) {
    LOCK();
    *(int *)local_e8.d.d = *(int *)local_e8.d.d + -1;
    UNLOCK();
    if (*(int *)local_e8.d.d == 0) {
      QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QMakeProject *)local_a8._0_8_ != (QMakeProject *)0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_a8._0_8_)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_a8._0_8_)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_a8._0_8_)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_a8._0_8_,2,0x10);
    }
  }
  if (*(Data **)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void
MakefileGenerator::writeInstalls(QTextStream &t, bool noBuild)
{
    QString rm_dir_contents("-$(DEL_FILE)");
    if (!isWindowsShell()) //ick
        rm_dir_contents = "-$(DEL_FILE) -r";

    QString all_installs, all_uninstalls;
    QSet<QString> made_dirs, removed_dirs;
    const ProStringList &l = project->values("INSTALLS");
    for (ProStringList::ConstIterator it = l.begin(); it != l.end(); ++it) {
        const ProKey pvar(*it + ".path");
        const ProStringList &installConfigValues = project->values(ProKey(*it + ".CONFIG"));
        if (installConfigValues.indexOf("no_path") == -1 &&
            installConfigValues.indexOf("dummy_install") == -1 &&
           project->values(pvar).isEmpty()) {
            warn_msg(WarnLogic, "%s is not defined: install target not created\n", pvar.toLatin1().constData());
            continue;
        }

        bool do_default = true;
        const QString root = installRoot();
        QString dst;
        if (installConfigValues.indexOf("no_path") == -1 &&
            installConfigValues.indexOf("dummy_install") == -1) {
            dst = fileFixify(project->first(pvar).toQString(), FileFixifyAbsolute, false);
            if(!dst.endsWith(Option::dir_sep))
                dst += Option::dir_sep;
        }

        QStringList tmp, inst, uninst;
        //other
        ProStringList tmp2 = project->values(ProKey(*it + ".extra"));
        if (tmp2.isEmpty())
            tmp2 = project->values(ProKey(*it + ".commands")); //to allow compatible name
        if (!tmp2.isEmpty()) {
            do_default = false;
            inst << tmp2.join(' ');
        }
        //masks
        tmp2 = findFilesInVPATH(project->values(ProKey(*it + ".files")), VPATH_NoFixify);
        tmp = fileFixify(tmp2.toQStringList(), FileFixifyAbsolute);
        if(!tmp.isEmpty()) {
            do_default = false;
            QString base_path = project->first(ProKey(*it + ".base")).toQString();
            if (!base_path.isEmpty()) {
                base_path = Option::fixPathToTargetOS(base_path, false, true);
                if (!base_path.endsWith(Option::dir_sep))
                    base_path += Option::dir_sep;
            }
            for(QStringList::Iterator wild_it = tmp.begin(); wild_it != tmp.end(); ++wild_it) {
                QString wild = Option::fixPathToTargetOS((*wild_it), false, false);
                QString dirstr = qmake_getpwd(), filestr = wild;
                int slsh = filestr.lastIndexOf(Option::dir_sep);
                if(slsh != -1) {
                    dirstr = filestr.left(slsh+1);
                    filestr.remove(0, slsh+1);
                }
                if(!dirstr.endsWith(Option::dir_sep))
                    dirstr += Option::dir_sep;
                QString dst_dir = dst;
                if (!base_path.isEmpty()) {
                    if (!dirstr.startsWith(base_path)) {
                        warn_msg(WarnLogic, "File %s in install rule %s does not start with base %s",
                                            qPrintable(wild), qPrintable((*it).toQString()),
                                            qPrintable(base_path));
                    } else {
                        QString dir_sfx = dirstr.mid(base_path.size());
                        dst_dir += dir_sfx;
                        if (!dir_sfx.isEmpty() && !made_dirs.contains(dir_sfx)) {
                            made_dirs.insert(dir_sfx);
                            QString tmp_dst = fileFixify(dst_dir, FileFixifyAbsolute, false);
                            tmp_dst.chop(1);
                            inst << mkdir_p_asstring(filePrefixRoot(root, tmp_dst));
                            for (int i = dst.size(); i < dst_dir.size(); i++) {
                                if (dst_dir.at(i) == Option::dir_sep) {
                                    QString subd = dst_dir.left(i);
                                    if (!removed_dirs.contains(subd)) {
                                        removed_dirs.insert(subd);
                                        tmp_dst = fileFixify(subd, FileFixifyAbsolute, false);
                                        uninst << "-$(DEL_DIR) "
                                                  + escapeFilePath(filePrefixRoot(root, tmp_dst));
                                    }
                                }
                            }
                        }
                    }
                }
                bool is_target = (wild == fileFixify(var("TARGET"), FileFixifyAbsolute));
                const bool noStrip = installConfigValues.contains("nostrip");
                if(is_target || exists(wild)) { //real file or target
                    QFileInfo fi(fileInfo(wild));
                    QString dst_file = filePrefixRoot(root, dst_dir);
                    if (!dst_file.endsWith(Option::dir_sep))
                        dst_file += Option::dir_sep;
                    dst_file += fi.fileName();
                    QString cmd;
                    if (is_target || (!fi.isDir() && fi.isExecutable()))
                       cmd = QLatin1String("$(QINSTALL_PROGRAM)");
                    else
                       cmd = QLatin1String("$(QINSTALL)");
                    cmd += " " + escapeFilePath(wild) + " " + escapeFilePath(dst_file);

                    QString sedArgs = createSedArgs(ProKey("QMAKE_INSTALL_REPLACE"), fi.fileName());
                    if (!sedArgs.isEmpty())
                        inst << "$(SED) " + sedArgs + ' ' + escapeFilePath(wild) + " > "
                                        + escapeFilePath(dst_file);
                    else
                        inst << cmd;

                    if (!noStrip && !project->isActiveConfig("debug_info") && !project->isActiveConfig("nostrip") &&
                       !fi.isDir() && fi.isExecutable() && !project->isEmpty("QMAKE_STRIP"))
                        inst << QString("-") + var("QMAKE_STRIP") + " " +
                                  escapeFilePath(filePrefixRoot(root, fileFixify(dst_dir + filestr, FileFixifyAbsolute, false)));
                    uninst.append(rm_dir_contents + " " + escapeFilePath(filePrefixRoot(root, fileFixify(dst_dir + filestr, FileFixifyAbsolute, false))));
                    continue;
                }
                QString local_dirstr = Option::normalizePath(dirstr);
                QStringList files = QDir(local_dirstr).entryList(QStringList(filestr),
                                            QDir::NoDotAndDotDot | QDir::AllEntries);
                if (installConfigValues.contains("no_check_exist") && files.isEmpty()) {
                    QString dst_file = filePrefixRoot(root, dst_dir);
                    if (!dst_file.endsWith(Option::dir_sep))
                        dst_file += Option::dir_sep;
                    dst_file += filestr;
                    QString cmd;
                    if (installConfigValues.contains("executable"))
                        cmd = QLatin1String("$(QINSTALL_PROGRAM)");
                    else
                        cmd = QLatin1String("$(QINSTALL)");
                    cmd += " " + escapeFilePath(wild) + " " + escapeFilePath(dst_file);
                    inst << cmd;
                    uninst.append(rm_dir_contents + " " + escapeFilePath(filePrefixRoot(root, fileFixify(dst_dir + filestr, FileFixifyAbsolute, false))));
                }
                for(int x = 0; x < files.size(); x++) {
                    QString file = files[x];
                    uninst.append(rm_dir_contents + " " + escapeFilePath(filePrefixRoot(root, fileFixify(dst_dir + file, FileFixifyAbsolute, false))));
                    QFileInfo fi(fileInfo(dirstr + file));
                    QString dst_file = filePrefixRoot(root, fileFixify(dst_dir, FileFixifyAbsolute, false));
                    if (!dst_file.endsWith(Option::dir_sep))
                        dst_file += Option::dir_sep;
                    dst_file += fi.fileName();
                    QString cmd = QLatin1String("$(QINSTALL) ") +
                                  escapeFilePath(dirstr + file) + " " + escapeFilePath(dst_file);
                    inst << cmd;
                    if (!noStrip && !project->isActiveConfig("debug_info") && !project->isActiveConfig("nostrip") &&
                       !fi.isDir() && fi.isExecutable() && !project->isEmpty("QMAKE_STRIP"))
                        inst << QString("-") + var("QMAKE_STRIP") + " " +
                                  escapeFilePath(filePrefixRoot(root, fileFixify(dst_dir + file, FileFixifyAbsolute, false)));
                }
            }
        }
        QString target;
        //default?
        if (do_default)
            target = defaultInstall((*it).toQString());
        else
            target = inst.join("\n\t");
        QString puninst = project->values(ProKey(*it + ".uninstall")).join(' ');
        if (!puninst.isEmpty())
            uninst << puninst;

        if (!target.isEmpty() || installConfigValues.indexOf("dummy_install") != -1) {
            if (noBuild || installConfigValues.indexOf("no_build") != -1)
                t << "install_" << (*it) << ":";
            else if(project->isActiveConfig("build_all"))
                t << "install_" << (*it) << ": all";
            else
                t << "install_" << (*it) << ": first";
            const ProStringList &deps = project->values(ProKey(*it + ".depends"));
            if(!deps.isEmpty()) {
                for (ProStringList::ConstIterator dep_it = deps.begin(); dep_it != deps.end(); ++dep_it) {
                    QString targ = var(ProKey(*dep_it + ".target"));
                    if(targ.isEmpty())
                        targ = (*dep_it).toQString();
                    t << " " << escapeDependencyPath(targ);
                }
            }
            t << " FORCE\n\t";
            const ProStringList &dirs = project->values(pvar);
            for (ProStringList::ConstIterator pit = dirs.begin(); pit != dirs.end(); ++pit) {
                QString tmp_dst = fileFixify((*pit).toQString(), FileFixifyAbsolute, false);
                t << mkdir_p_asstring(filePrefixRoot(root, tmp_dst)) << "\n\t";
            }
            t << target << Qt::endl << Qt::endl;
            if(!uninst.isEmpty()) {
                t << "uninstall_" << (*it) << ": FORCE";
                for (int i = uninst.size(); --i >= 0; )
                    t << "\n\t" << uninst.at(i);
                t << "\n\t-$(DEL_DIR) " << escapeFilePath(filePrefixRoot(root, dst)) << " \n\n";
            }
            t << Qt::endl;

            if (installConfigValues.indexOf("no_default_install") == -1) {
                all_installs += QString("install_") + (*it) + " ";
                if(!uninst.isEmpty())
                    all_uninstalls += "uninstall_" + (*it) + " ";
            }
        }   else {
            debug_msg(1, "no definition for install %s: install target not created",(*it).toLatin1().constData());
        }
    }
    t << "install:" << depVar("INSTALLDEPS") << ' ' << all_installs
      << " FORCE\n\nuninstall: " << all_uninstalls << depVar("UNINSTALLDEPS")
      << " FORCE\n\n";
}